

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  ulong uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  byte bVar88;
  byte bVar89;
  uint uVar90;
  uint uVar91;
  undefined1 (*pauVar92) [32];
  ulong uVar93;
  uint uVar94;
  uint uVar95;
  long lVar96;
  bool bVar97;
  int iVar98;
  ulong uVar99;
  bool bVar100;
  float fVar101;
  float fVar132;
  vint4 bi_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar133;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar106 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar137;
  float fVar159;
  float fVar163;
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar167;
  undefined1 auVar144 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar175;
  float fVar198;
  float fVar199;
  vint4 bi_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar200;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar182 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar201;
  float fVar222;
  float fVar223;
  vint4 ai_1;
  undefined1 auVar202 [16];
  float fVar224;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [28];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar225;
  float fVar241;
  float fVar243;
  vint4 ai_2;
  undefined1 auVar227 [16];
  float fVar245;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar226;
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar251;
  float fVar264;
  float fVar265;
  undefined1 auVar252 [16];
  float fVar266;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar272;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar269;
  float fVar271;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar267;
  float fVar268;
  float fVar270;
  undefined1 auVar263 [64];
  float fVar273;
  float fVar286;
  float fVar287;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar288;
  float fVar290;
  float fVar291;
  float fVar294;
  float fVar297;
  float fVar300;
  undefined1 auVar279 [32];
  float fVar289;
  float fVar292;
  float fVar295;
  float fVar298;
  float fVar301;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar293;
  float fVar296;
  float fVar299;
  undefined1 auVar285 [64];
  float fVar302;
  float fVar312;
  float fVar313;
  vint4 ai;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar315;
  undefined1 auVar308 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar311 [64];
  float fVar323;
  float fVar332;
  float fVar333;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  float fVar339;
  float fVar346;
  float fVar348;
  undefined1 auVar341 [16];
  float fVar340;
  undefined1 auVar342 [16];
  undefined1 auVar343 [28];
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar344 [32];
  float fVar352;
  float fVar354;
  undefined1 auVar345 [64];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [64];
  float fVar368;
  float fVar378;
  undefined1 auVar370 [32];
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  undefined1 auVar371 [64];
  float fVar379;
  float fVar384;
  float fVar385;
  undefined1 auVar380 [16];
  float fVar386;
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  float fVar387;
  float fVar388;
  float fVar389;
  undefined1 auVar383 [64];
  float fVar390;
  float fVar395;
  float fVar396;
  undefined1 auVar391 [16];
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar401 [32];
  float fVar402;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b04;
  float local_b00;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  int local_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined4 local_8b8;
  float local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  uint local_8a8;
  uint local_8a4;
  uint local_8a0;
  ulong local_888;
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar360 [16];
  undefined1 auVar369 [16];
  
  PVar12 = prim[1];
  uVar99 = (ulong)(byte)PVar12;
  lVar18 = uVar99 * 0x25;
  fVar101 = *(float *)(prim + lVar18 + 0x12);
  auVar208 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar18 + 6));
  auVar141._0_4_ = fVar101 * auVar208._0_4_;
  auVar141._4_4_ = fVar101 * auVar208._4_4_;
  auVar141._8_4_ = fVar101 * auVar208._8_4_;
  auVar141._12_4_ = fVar101 * auVar208._12_4_;
  auVar303._0_4_ = fVar101 * (ray->dir).field_0.m128[0];
  auVar303._4_4_ = fVar101 * (ray->dir).field_0.m128[1];
  auVar303._8_4_ = fVar101 * (ray->dir).field_0.m128[2];
  auVar303._12_4_ = fVar101 * (ray->dir).field_0.m128[3];
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xf + 6)));
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar342 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar99 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar342 = vcvtdq2ps_avx(auVar342);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x1a + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x1b + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x1c + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar27 = vshufps_avx(auVar303,auVar303,0);
  auVar28 = vshufps_avx(auVar303,auVar303,0x55);
  auVar29 = vshufps_avx(auVar303,auVar303,0xaa);
  fVar101 = auVar29._0_4_;
  fVar140 = auVar29._4_4_;
  fVar162 = auVar29._8_4_;
  fVar166 = auVar29._12_4_;
  fVar225 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  fVar243 = auVar28._8_4_;
  fVar245 = auVar28._12_4_;
  fVar201 = auVar27._0_4_;
  fVar222 = auVar27._4_4_;
  fVar223 = auVar27._8_4_;
  fVar224 = auVar27._12_4_;
  auVar380._0_4_ = fVar201 * auVar208._0_4_ + fVar225 * auVar214._0_4_ + fVar101 * auVar112._0_4_;
  auVar380._4_4_ = fVar222 * auVar208._4_4_ + fVar241 * auVar214._4_4_ + fVar140 * auVar112._4_4_;
  auVar380._8_4_ = fVar223 * auVar208._8_4_ + fVar243 * auVar214._8_4_ + fVar162 * auVar112._8_4_;
  auVar380._12_4_ =
       fVar224 * auVar208._12_4_ + fVar245 * auVar214._12_4_ + fVar166 * auVar112._12_4_;
  auVar391._0_4_ = fVar201 * auVar183._0_4_ + fVar225 * auVar114._0_4_ + auVar342._0_4_ * fVar101;
  auVar391._4_4_ = fVar222 * auVar183._4_4_ + fVar241 * auVar114._4_4_ + auVar342._4_4_ * fVar140;
  auVar391._8_4_ = fVar223 * auVar183._8_4_ + fVar243 * auVar114._8_4_ + auVar342._8_4_ * fVar162;
  auVar391._12_4_ =
       fVar224 * auVar183._12_4_ + fVar245 * auVar114._12_4_ + auVar342._12_4_ * fVar166;
  auVar304._0_4_ = fVar201 * auVar147._0_4_ + fVar225 * auVar113._0_4_ + auVar150._0_4_ * fVar101;
  auVar304._4_4_ = fVar222 * auVar147._4_4_ + fVar241 * auVar113._4_4_ + auVar150._4_4_ * fVar140;
  auVar304._8_4_ = fVar223 * auVar147._8_4_ + fVar243 * auVar113._8_4_ + auVar150._8_4_ * fVar162;
  auVar304._12_4_ =
       fVar224 * auVar147._12_4_ + fVar245 * auVar113._12_4_ + auVar150._12_4_ * fVar166;
  auVar27 = vshufps_avx(auVar141,auVar141,0);
  auVar28 = vshufps_avx(auVar141,auVar141,0x55);
  auVar29 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar101 = auVar29._0_4_;
  fVar140 = auVar29._4_4_;
  fVar162 = auVar29._8_4_;
  fVar166 = auVar29._12_4_;
  fVar225 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  fVar243 = auVar28._8_4_;
  fVar245 = auVar28._12_4_;
  fVar201 = auVar27._0_4_;
  fVar222 = auVar27._4_4_;
  fVar223 = auVar27._8_4_;
  fVar224 = auVar27._12_4_;
  auVar142._0_4_ = fVar201 * auVar208._0_4_ + fVar225 * auVar214._0_4_ + fVar101 * auVar112._0_4_;
  auVar142._4_4_ = fVar222 * auVar208._4_4_ + fVar241 * auVar214._4_4_ + fVar140 * auVar112._4_4_;
  auVar142._8_4_ = fVar223 * auVar208._8_4_ + fVar243 * auVar214._8_4_ + fVar162 * auVar112._8_4_;
  auVar142._12_4_ =
       fVar224 * auVar208._12_4_ + fVar245 * auVar214._12_4_ + fVar166 * auVar112._12_4_;
  auVar102._0_4_ = fVar201 * auVar183._0_4_ + auVar342._0_4_ * fVar101 + fVar225 * auVar114._0_4_;
  auVar102._4_4_ = fVar222 * auVar183._4_4_ + auVar342._4_4_ * fVar140 + fVar241 * auVar114._4_4_;
  auVar102._8_4_ = fVar223 * auVar183._8_4_ + auVar342._8_4_ * fVar162 + fVar243 * auVar114._8_4_;
  auVar102._12_4_ =
       fVar224 * auVar183._12_4_ + auVar342._12_4_ * fVar166 + fVar245 * auVar114._12_4_;
  auVar324._8_4_ = 0x7fffffff;
  auVar324._0_8_ = 0x7fffffff7fffffff;
  auVar324._12_4_ = 0x7fffffff;
  auVar208 = vandps_avx(auVar380,auVar324);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  auVar208 = vcmpps_avx(auVar208,auVar227,1);
  auVar214 = vblendvps_avx(auVar380,auVar227,auVar208);
  auVar208 = vandps_avx(auVar391,auVar324);
  auVar208 = vcmpps_avx(auVar208,auVar227,1);
  auVar112 = vblendvps_avx(auVar391,auVar227,auVar208);
  auVar208 = vandps_avx(auVar324,auVar304);
  auVar208 = vcmpps_avx(auVar208,auVar227,1);
  auVar208 = vblendvps_avx(auVar304,auVar227,auVar208);
  auVar176._0_4_ = fVar201 * auVar147._0_4_ + fVar225 * auVar113._0_4_ + auVar150._0_4_ * fVar101;
  auVar176._4_4_ = fVar222 * auVar147._4_4_ + fVar241 * auVar113._4_4_ + auVar150._4_4_ * fVar140;
  auVar176._8_4_ = fVar223 * auVar147._8_4_ + fVar243 * auVar113._8_4_ + auVar150._8_4_ * fVar162;
  auVar176._12_4_ =
       fVar224 * auVar147._12_4_ + fVar245 * auVar113._12_4_ + auVar150._12_4_ * fVar166;
  auVar183 = vrcpps_avx(auVar214);
  fVar201 = auVar183._0_4_;
  auVar202._0_4_ = fVar201 * auVar214._0_4_;
  fVar222 = auVar183._4_4_;
  auVar202._4_4_ = fVar222 * auVar214._4_4_;
  fVar223 = auVar183._8_4_;
  auVar202._8_4_ = fVar223 * auVar214._8_4_;
  fVar224 = auVar183._12_4_;
  auVar202._12_4_ = fVar224 * auVar214._12_4_;
  auVar274._8_4_ = 0x3f800000;
  auVar274._0_8_ = 0x3f8000003f800000;
  auVar274._12_4_ = 0x3f800000;
  auVar214 = vsubps_avx(auVar274,auVar202);
  fVar201 = fVar201 + fVar201 * auVar214._0_4_;
  fVar222 = fVar222 + fVar222 * auVar214._4_4_;
  fVar223 = fVar223 + fVar223 * auVar214._8_4_;
  fVar224 = fVar224 + fVar224 * auVar214._12_4_;
  auVar214 = vrcpps_avx(auVar112);
  fVar225 = auVar214._0_4_;
  auVar252._0_4_ = fVar225 * auVar112._0_4_;
  fVar241 = auVar214._4_4_;
  auVar252._4_4_ = fVar241 * auVar112._4_4_;
  fVar243 = auVar214._8_4_;
  auVar252._8_4_ = fVar243 * auVar112._8_4_;
  fVar245 = auVar214._12_4_;
  auVar252._12_4_ = fVar245 * auVar112._12_4_;
  auVar214 = vsubps_avx(auVar274,auVar252);
  fVar225 = fVar225 + fVar225 * auVar214._0_4_;
  fVar241 = fVar241 + fVar241 * auVar214._4_4_;
  fVar243 = fVar243 + fVar243 * auVar214._8_4_;
  fVar245 = fVar245 + fVar245 * auVar214._12_4_;
  auVar214 = vrcpps_avx(auVar208);
  fVar251 = auVar214._0_4_;
  auVar305._0_4_ = fVar251 * auVar208._0_4_;
  fVar264 = auVar214._4_4_;
  auVar305._4_4_ = fVar264 * auVar208._4_4_;
  fVar265 = auVar214._8_4_;
  auVar305._8_4_ = fVar265 * auVar208._8_4_;
  fVar266 = auVar214._12_4_;
  auVar305._12_4_ = fVar266 * auVar208._12_4_;
  auVar208 = vsubps_avx(auVar274,auVar305);
  fVar251 = fVar251 + fVar251 * auVar208._0_4_;
  fVar264 = fVar264 + fVar264 * auVar208._4_4_;
  fVar265 = fVar265 + fVar265 * auVar208._8_4_;
  fVar266 = fVar266 + fVar266 * auVar208._12_4_;
  auVar208 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar18 + 0x16)) *
                           *(float *)(prim + lVar18 + 0x1a)));
  auVar112 = vshufps_avx(auVar208,auVar208,0);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar208 = vpmovsxwd_avx(auVar208);
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar99 * 0xb + 6);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar183 = vsubps_avx(auVar214,auVar208);
  fVar101 = auVar112._0_4_;
  fVar140 = auVar112._4_4_;
  fVar162 = auVar112._8_4_;
  fVar166 = auVar112._12_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar214 = vpmovsxwd_avx(auVar112);
  auVar306._0_4_ = auVar183._0_4_ * fVar101 + auVar208._0_4_;
  auVar306._4_4_ = auVar183._4_4_ * fVar140 + auVar208._4_4_;
  auVar306._8_4_ = auVar183._8_4_ * fVar162 + auVar208._8_4_;
  auVar306._12_4_ = auVar183._12_4_ * fVar166 + auVar208._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar99 * 0xd + 6);
  auVar112 = vpmovsxwd_avx(auVar183);
  auVar208 = vcvtdq2ps_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar112);
  auVar214 = vsubps_avx(auVar214,auVar208);
  auVar325._0_4_ = auVar214._0_4_ * fVar101 + auVar208._0_4_;
  auVar325._4_4_ = auVar214._4_4_ * fVar140 + auVar208._4_4_;
  auVar325._8_4_ = auVar214._8_4_ * fVar162 + auVar208._8_4_;
  auVar325._12_4_ = auVar214._12_4_ * fVar166 + auVar208._12_4_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar99 * 0x12 + 6);
  auVar208 = vpmovsxwd_avx(auVar114);
  uVar93 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar342._8_8_ = 0;
  auVar342._0_8_ = *(ulong *)(prim + uVar99 * 2 + uVar93 + 6);
  auVar214 = vpmovsxwd_avx(auVar342);
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar208);
  auVar341._0_4_ = auVar214._0_4_ * fVar101 + auVar208._0_4_;
  auVar341._4_4_ = auVar214._4_4_ * fVar140 + auVar208._4_4_;
  auVar341._8_4_ = auVar214._8_4_ * fVar162 + auVar208._8_4_;
  auVar341._12_4_ = auVar214._12_4_ * fVar166 + auVar208._12_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar208 = vpmovsxwd_avx(auVar147);
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar99 * 0x18 + 6);
  auVar214 = vpmovsxwd_avx(auVar113);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar112 = vsubps_avx(auVar214,auVar208);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar99 * 0x1d + 6);
  auVar214 = vpmovsxwd_avx(auVar150);
  auVar360._0_4_ = auVar112._0_4_ * fVar101 + auVar208._0_4_;
  auVar360._4_4_ = auVar112._4_4_ * fVar140 + auVar208._4_4_;
  auVar360._8_4_ = auVar112._8_4_ * fVar162 + auVar208._8_4_;
  auVar360._12_4_ = auVar112._12_4_ * fVar166 + auVar208._12_4_;
  auVar367 = ZEXT1664(auVar360);
  auVar208 = vcvtdq2ps_avx(auVar214);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar99 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar214 = vpmovsxwd_avx(auVar27);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar208);
  auVar369._0_4_ = auVar214._0_4_ * fVar101 + auVar208._0_4_;
  auVar369._4_4_ = auVar214._4_4_ * fVar140 + auVar208._4_4_;
  auVar369._8_4_ = auVar214._8_4_ * fVar162 + auVar208._8_4_;
  auVar369._12_4_ = auVar214._12_4_ * fVar166 + auVar208._12_4_;
  auVar371 = ZEXT1664(auVar369);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar99) + 6);
  auVar208 = vpmovsxwd_avx(auVar28);
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar383 = ZEXT1664(auVar208);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar99 * 0x23 + 6);
  auVar214 = vpmovsxwd_avx(auVar29);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar208);
  auVar275._0_4_ = auVar208._0_4_ + auVar214._0_4_ * fVar101;
  auVar275._4_4_ = auVar208._4_4_ + auVar214._4_4_ * fVar140;
  auVar275._8_4_ = auVar208._8_4_ + auVar214._8_4_ * fVar162;
  auVar275._12_4_ = auVar208._12_4_ + auVar214._12_4_ * fVar166;
  auVar208 = vsubps_avx(auVar306,auVar142);
  auVar307._0_4_ = fVar201 * auVar208._0_4_;
  auVar307._4_4_ = fVar222 * auVar208._4_4_;
  auVar307._8_4_ = fVar223 * auVar208._8_4_;
  auVar307._12_4_ = fVar224 * auVar208._12_4_;
  auVar208 = vsubps_avx(auVar325,auVar142);
  auVar143._0_4_ = fVar201 * auVar208._0_4_;
  auVar143._4_4_ = fVar222 * auVar208._4_4_;
  auVar143._8_4_ = fVar223 * auVar208._8_4_;
  auVar143._12_4_ = fVar224 * auVar208._12_4_;
  auVar208 = vsubps_avx(auVar341,auVar102);
  auVar203._0_4_ = fVar225 * auVar208._0_4_;
  auVar203._4_4_ = fVar241 * auVar208._4_4_;
  auVar203._8_4_ = fVar243 * auVar208._8_4_;
  auVar203._12_4_ = fVar245 * auVar208._12_4_;
  auVar208 = vsubps_avx(auVar360,auVar102);
  auVar103._0_4_ = fVar225 * auVar208._0_4_;
  auVar103._4_4_ = fVar241 * auVar208._4_4_;
  auVar103._8_4_ = fVar243 * auVar208._8_4_;
  auVar103._12_4_ = fVar245 * auVar208._12_4_;
  auVar208 = vsubps_avx(auVar369,auVar176);
  auVar228._0_4_ = fVar251 * auVar208._0_4_;
  auVar228._4_4_ = fVar264 * auVar208._4_4_;
  auVar228._8_4_ = fVar265 * auVar208._8_4_;
  auVar228._12_4_ = fVar266 * auVar208._12_4_;
  auVar208 = vsubps_avx(auVar275,auVar176);
  auVar177._0_4_ = fVar251 * auVar208._0_4_;
  auVar177._4_4_ = fVar264 * auVar208._4_4_;
  auVar177._8_4_ = fVar265 * auVar208._8_4_;
  auVar177._12_4_ = fVar266 * auVar208._12_4_;
  auVar208 = vpminsd_avx(auVar307,auVar143);
  auVar214 = vpminsd_avx(auVar203,auVar103);
  auVar208 = vmaxps_avx(auVar208,auVar214);
  auVar214 = vpminsd_avx(auVar228,auVar177);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar326._4_4_ = uVar7;
  auVar326._0_4_ = uVar7;
  auVar326._8_4_ = uVar7;
  auVar326._12_4_ = uVar7;
  auVar214 = vmaxps_avx(auVar214,auVar326);
  auVar208 = vmaxps_avx(auVar208,auVar214);
  local_520._0_4_ = auVar208._0_4_ * 0.99999964;
  local_520._4_4_ = auVar208._4_4_ * 0.99999964;
  local_520._8_4_ = auVar208._8_4_ * 0.99999964;
  local_520._12_4_ = auVar208._12_4_ * 0.99999964;
  auVar208 = vpmaxsd_avx(auVar307,auVar143);
  auVar214 = vpmaxsd_avx(auVar203,auVar103);
  auVar208 = vminps_avx(auVar208,auVar214);
  auVar214 = vpmaxsd_avx(auVar228,auVar177);
  fVar101 = ray->tfar;
  auVar178._4_4_ = fVar101;
  auVar178._0_4_ = fVar101;
  auVar178._8_4_ = fVar101;
  auVar178._12_4_ = fVar101;
  auVar214 = vminps_avx(auVar214,auVar178);
  auVar208 = vminps_avx(auVar208,auVar214);
  auVar104._0_4_ = auVar208._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar208._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar208._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar208._12_4_ * 1.0000004;
  auVar208 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar214 = vpcmpgtd_avx(auVar208,_DAT_01f7fcf0);
  auVar208 = vcmpps_avx(local_520,auVar104,2);
  auVar208 = vandps_avx(auVar208,auVar214);
  uVar90 = vmovmskps_avx(auVar208);
  if (uVar90 == 0) {
    return false;
  }
  auVar118._16_16_ = mm_lookupmask_ps._240_16_;
  auVar118._0_16_ = mm_lookupmask_ps._240_16_;
  uVar90 = uVar90 & 0xff;
  local_2e0 = vblendps_avx(auVar118,ZEXT832(0) << 0x20,0x80);
  local_7f0 = prim;
LAB_00f322c1:
  local_7e8 = (ulong)uVar90;
  lVar18 = 0;
  if (local_7e8 != 0) {
    for (; (uVar90 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  uVar90 = *(uint *)(local_7f0 + 2);
  local_888 = (ulong)*(uint *)(local_7f0 + lVar18 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[uVar90].ptr;
  uVar99 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           local_888 *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar101 = (pGVar13->time_range).lower;
  fVar101 = pGVar13->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar101) / ((pGVar13->time_range).upper - fVar101));
  auVar208 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
  auVar208 = vminss_avx(auVar208,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar208 = vmaxss_avx(ZEXT816(0) << 0x20,auVar208);
  fVar101 = fVar101 - auVar208._0_4_;
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar96 = (long)(int)auVar208._0_4_ * 0x38;
  lVar18 = *(long *)(_Var14 + 0x10 + lVar96);
  lVar15 = *(long *)(_Var14 + 0x38 + lVar96);
  lVar16 = *(long *)(_Var14 + 0x48 + lVar96);
  auVar208 = vshufps_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),0);
  pfVar1 = (float *)(lVar15 + uVar99 * lVar16);
  fVar201 = auVar208._0_4_;
  fVar222 = auVar208._4_4_;
  fVar223 = auVar208._8_4_;
  fVar224 = auVar208._12_4_;
  pfVar2 = (float *)(lVar15 + (uVar99 + 1) * lVar16);
  pfVar3 = (float *)(lVar15 + (uVar99 + 2) * lVar16);
  pfVar4 = (float *)(lVar15 + lVar16 * (uVar99 + 3));
  lVar15 = *(long *)(_Var14 + lVar96);
  auVar208 = vshufps_avx(ZEXT416((uint)(1.0 - fVar101)),ZEXT416((uint)(1.0 - fVar101)),0);
  pfVar5 = (float *)(lVar15 + lVar18 * uVar99);
  fVar101 = auVar208._0_4_;
  fVar140 = auVar208._4_4_;
  fVar162 = auVar208._8_4_;
  fVar166 = auVar208._12_4_;
  pfVar6 = (float *)(lVar15 + lVar18 * (uVar99 + 1));
  auVar179._0_4_ = fVar201 * *pfVar1 + fVar101 * *pfVar5;
  auVar179._4_4_ = fVar222 * pfVar1[1] + fVar140 * pfVar5[1];
  auVar179._8_4_ = fVar223 * pfVar1[2] + fVar162 * pfVar5[2];
  auVar179._12_4_ = fVar224 * pfVar1[3] + fVar166 * pfVar5[3];
  pfVar1 = (float *)(lVar15 + lVar18 * (uVar99 + 2));
  auVar204._0_4_ = fVar101 * *pfVar6 + fVar201 * *pfVar2;
  auVar204._4_4_ = fVar140 * pfVar6[1] + fVar222 * pfVar2[1];
  auVar204._8_4_ = fVar162 * pfVar6[2] + fVar223 * pfVar2[2];
  auVar204._12_4_ = fVar166 * pfVar6[3] + fVar224 * pfVar2[3];
  auVar229._0_4_ = fVar101 * *pfVar1 + fVar201 * *pfVar3;
  auVar229._4_4_ = fVar140 * pfVar1[1] + fVar222 * pfVar3[1];
  auVar229._8_4_ = fVar162 * pfVar1[2] + fVar223 * pfVar3[2];
  auVar229._12_4_ = fVar166 * pfVar1[3] + fVar224 * pfVar3[3];
  pfVar1 = (float *)(lVar15 + lVar18 * (uVar99 + 3));
  auVar253._0_4_ = fVar101 * *pfVar1 + fVar201 * *pfVar4;
  auVar253._4_4_ = fVar140 * pfVar1[1] + fVar222 * pfVar4[1];
  auVar253._8_4_ = fVar162 * pfVar1[2] + fVar223 * pfVar4[2];
  auVar253._12_4_ = fVar166 * pfVar1[3] + fVar224 * pfVar4[3];
  auVar105._0_4_ = (auVar179._0_4_ + auVar204._0_4_ + auVar229._0_4_ + auVar253._0_4_) * 0.25;
  auVar105._4_4_ = (auVar179._4_4_ + auVar204._4_4_ + auVar229._4_4_ + auVar253._4_4_) * 0.25;
  auVar105._8_4_ = (auVar179._8_4_ + auVar204._8_4_ + auVar229._8_4_ + auVar253._8_4_) * 0.25;
  auVar105._12_4_ = (auVar179._12_4_ + auVar204._12_4_ + auVar229._12_4_ + auVar253._12_4_) * 0.25;
  aVar9 = (ray->org).field_0.field_1;
  aVar10 = (ray->dir).field_0.field_1;
  auVar208 = vsubps_avx(auVar105,(undefined1  [16])aVar9);
  auVar208 = vdpps_avx(auVar208,(undefined1  [16])aVar10,0x7f);
  auVar214 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar112 = vrcpss_avx(auVar214,auVar214);
  auVar345 = ZEXT464(0x40000000);
  fVar101 = auVar208._0_4_ * auVar112._0_4_ * (2.0 - auVar112._0_4_ * auVar214._0_4_);
  local_800 = ZEXT416((uint)fVar101);
  auVar214 = vshufps_avx(local_800,ZEXT416((uint)fVar101),0);
  fVar101 = aVar10.x;
  fVar140 = aVar10.y;
  fVar162 = aVar10.z;
  aVar167 = aVar10.field_3;
  auVar276._0_4_ = aVar9.x + fVar101 * auVar214._0_4_;
  auVar276._4_4_ = aVar9.y + fVar140 * auVar214._4_4_;
  auVar276._8_4_ = aVar9.z + fVar162 * auVar214._8_4_;
  auVar276._12_4_ = aVar9.field_3.w + aVar167.w * auVar214._12_4_;
  auVar208 = vblendps_avx(auVar276,_DAT_01f7aa10,8);
  _local_960 = vsubps_avx(auVar179,auVar208);
  auVar311 = ZEXT1664(_local_960);
  _local_970 = vsubps_avx(auVar229,auVar208);
  _local_980 = vsubps_avx(auVar204,auVar208);
  _local_990 = vsubps_avx(auVar253,auVar208);
  auVar263 = ZEXT1664(_local_990);
  auVar208 = vshufps_avx(_local_960,_local_960,0);
  register0x00001290 = auVar208;
  _local_1e0 = auVar208;
  auVar208 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001290 = auVar208;
  _local_200 = auVar208;
  auVar208 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001290 = auVar208;
  _local_220 = auVar208;
  auVar208 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001290 = auVar208;
  _local_240 = auVar208;
  auVar208 = vshufps_avx(_local_980,_local_980,0);
  register0x00001290 = auVar208;
  _local_260 = auVar208;
  auVar208 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001290 = auVar208;
  _local_280 = auVar208;
  auVar208 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001290 = auVar208;
  _local_2a0 = auVar208;
  auVar144._0_4_ = fVar101 * fVar101;
  auVar144._4_4_ = fVar140 * fVar140;
  auVar144._8_4_ = fVar162 * fVar162;
  auVar144._12_4_ = aVar167.w * aVar167.w;
  auVar208 = vshufps_avx(auVar144,auVar144,0xaa);
  auVar112 = vshufps_avx(auVar144,auVar144,0x55);
  auVar183 = vshufps_avx(_local_980,_local_980,0xff);
  register0x000012d0 = auVar183;
  _local_340 = auVar183;
  auVar183 = vshufps_avx(auVar144,auVar144,0);
  local_2c0._0_4_ = auVar183._0_4_ + auVar112._0_4_ + auVar208._0_4_;
  local_2c0._4_4_ = auVar183._4_4_ + auVar112._4_4_ + auVar208._4_4_;
  local_2c0._8_4_ = auVar183._8_4_ + auVar112._8_4_ + auVar208._8_4_;
  local_2c0._12_4_ = auVar183._12_4_ + auVar112._12_4_ + auVar208._12_4_;
  local_2c0._16_4_ = auVar183._0_4_ + auVar112._0_4_ + auVar208._0_4_;
  local_2c0._20_4_ = auVar183._4_4_ + auVar112._4_4_ + auVar208._4_4_;
  local_2c0._24_4_ = auVar183._8_4_ + auVar112._8_4_ + auVar208._8_4_;
  local_2c0._28_4_ = auVar183._12_4_ + auVar112._12_4_ + auVar208._12_4_;
  auVar285 = ZEXT3264(local_2c0);
  auVar208 = vshufps_avx(_local_970,_local_970,0);
  register0x00001250 = auVar208;
  _local_360 = auVar208;
  auVar208 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001250 = auVar208;
  _local_380 = auVar208;
  auVar208 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001250 = auVar208;
  _local_3a0 = auVar208;
  auVar208 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001250 = auVar208;
  _local_3c0 = auVar208;
  auVar208 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar208;
  _local_3e0 = auVar208;
  auVar208 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar208;
  _local_400 = auVar208;
  auVar208 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar208;
  _local_420 = auVar208;
  auVar208 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar208;
  _local_440 = auVar208;
  local_a60._16_16_ = auVar214;
  local_a60._0_16_ = auVar214;
  local_b04 = 1;
  uVar99 = 0;
  bVar97 = false;
  local_560 = (ray->dir).field_0.m128[0];
  local_760 = (ray->dir).field_0.m128[1];
  local_780 = (ray->dir).field_0.m128[2];
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_2c0,auVar119);
  local_510 = ZEXT816(0x3f80000000000000);
  fStack_77c = local_780;
  fStack_778 = local_780;
  fStack_774 = local_780;
  fStack_770 = local_780;
  fStack_76c = local_780;
  fStack_768 = local_780;
  fStack_764 = local_780;
  fStack_75c = local_760;
  fStack_758 = local_760;
  fStack_754 = local_760;
  fStack_750 = local_760;
  fStack_74c = local_760;
  fStack_748 = local_760;
  fStack_744 = local_760;
  fStack_55c = local_560;
  fStack_558 = local_560;
  fStack_554 = local_560;
  fStack_550 = local_560;
  fStack_54c = local_560;
  fStack_548 = local_560;
  fStack_544 = local_560;
  do {
    auVar401._8_4_ = 0x3f800000;
    auVar401._0_8_ = 0x3f8000003f800000;
    auVar401._12_4_ = 0x3f800000;
    auVar401._16_4_ = 0x3f800000;
    auVar401._20_4_ = 0x3f800000;
    iVar98 = (int)uVar99;
    auVar401._24_4_ = 0x3f800000;
    auVar401._28_4_ = 0x3f800000;
    auVar208 = vmovshdup_avx(local_510);
    auVar112 = vsubps_avx(auVar208,local_510);
    auVar208 = vshufps_avx(local_510,local_510,0);
    local_740._16_16_ = auVar208;
    local_740._0_16_ = auVar208;
    auVar214 = vshufps_avx(auVar112,auVar112,0);
    fVar137 = auVar214._0_4_;
    fVar159 = auVar214._4_4_;
    fVar163 = auVar214._8_4_;
    fVar168 = auVar214._12_4_;
    fVar175 = auVar208._0_4_;
    auVar218._0_4_ = fVar175 + fVar137 * 0.0;
    fVar198 = auVar208._4_4_;
    auVar218._4_4_ = fVar198 + fVar159 * 0.14285715;
    fVar199 = auVar208._8_4_;
    auVar218._8_4_ = fVar199 + fVar163 * 0.2857143;
    fVar200 = auVar208._12_4_;
    auVar218._12_4_ = fVar200 + fVar168 * 0.42857146;
    auVar218._16_4_ = fVar175 + fVar137 * 0.5714286;
    auVar218._20_4_ = fVar198 + fVar159 * 0.71428573;
    auVar218._24_4_ = fVar199 + fVar163 * 0.8571429;
    auVar218._28_4_ = fVar200 + fVar168;
    auVar118 = vsubps_avx(auVar401,auVar218);
    fVar140 = auVar118._0_4_;
    fVar162 = auVar118._4_4_;
    fVar166 = auVar118._8_4_;
    fVar201 = auVar118._12_4_;
    fVar222 = auVar118._16_4_;
    fVar223 = auVar118._20_4_;
    fVar224 = auVar118._24_4_;
    fVar245 = fVar140 * fVar140 * fVar140;
    fVar265 = fVar162 * fVar162 * fVar162;
    fVar287 = fVar166 * fVar166 * fVar166;
    fVar290 = fVar201 * fVar201 * fVar201;
    fVar293 = fVar222 * fVar222 * fVar222;
    fVar296 = fVar223 * fVar223 * fVar223;
    fVar299 = fVar224 * fVar224 * fVar224;
    fVar302 = auVar218._0_4_ * auVar218._0_4_ * auVar218._0_4_;
    fVar312 = auVar218._4_4_ * auVar218._4_4_ * auVar218._4_4_;
    fVar313 = auVar218._8_4_ * auVar218._8_4_ * auVar218._8_4_;
    fVar315 = auVar218._12_4_ * auVar218._12_4_ * auVar218._12_4_;
    fVar317 = auVar218._16_4_ * auVar218._16_4_ * auVar218._16_4_;
    fVar319 = auVar218._20_4_ * auVar218._20_4_ * auVar218._20_4_;
    fVar321 = auVar218._24_4_ * auVar218._24_4_ * auVar218._24_4_;
    fVar101 = auVar263._28_4_;
    fVar225 = auVar218._0_4_ * fVar140;
    fVar241 = auVar218._4_4_ * fVar162;
    fVar243 = auVar218._8_4_ * fVar166;
    fVar264 = auVar218._12_4_ * fVar201;
    fVar267 = auVar218._16_4_ * fVar222;
    fVar268 = auVar218._20_4_ * fVar223;
    fVar270 = auVar218._24_4_ * fVar224;
    fVar251 = auVar367._28_4_ + auVar383._28_4_;
    fVar338 = auVar311._28_4_ + fVar101 + fVar251;
    fVar358 = fVar251 + auVar285._28_4_ + auVar371._28_4_ + auVar345._28_4_;
    fVar251 = fVar245 * 0.16666667;
    fVar266 = fVar265 * 0.16666667;
    fVar288 = fVar287 * 0.16666667;
    fVar291 = fVar290 * 0.16666667;
    fVar294 = fVar293 * 0.16666667;
    fVar297 = fVar296 * 0.16666667;
    fVar300 = fVar299 * 0.16666667;
    fVar323 = (fVar302 + fVar245 * 4.0 + fVar140 * fVar225 * 12.0 + auVar218._0_4_ * fVar225 * 6.0)
              * 0.16666667;
    fVar332 = (fVar312 + fVar265 * 4.0 + fVar162 * fVar241 * 12.0 + auVar218._4_4_ * fVar241 * 6.0)
              * 0.16666667;
    fVar333 = (fVar313 + fVar287 * 4.0 + fVar166 * fVar243 * 12.0 + auVar218._8_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar334 = (fVar315 + fVar290 * 4.0 + fVar201 * fVar264 * 12.0 + auVar218._12_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar335 = (fVar317 + fVar293 * 4.0 + fVar222 * fVar267 * 12.0 + auVar218._16_4_ * fVar267 * 6.0)
              * 0.16666667;
    fVar336 = (fVar319 + fVar296 * 4.0 + fVar223 * fVar268 * 12.0 + auVar218._20_4_ * fVar268 * 6.0)
              * 0.16666667;
    fVar337 = (fVar321 + fVar299 * 4.0 + fVar224 * fVar270 * 12.0 + auVar218._24_4_ * fVar270 * 6.0)
              * 0.16666667;
    fVar245 = (fVar302 * 4.0 + fVar245 + auVar218._0_4_ * fVar225 * 12.0 + fVar140 * fVar225 * 6.0)
              * 0.16666667;
    fVar265 = (fVar312 * 4.0 + fVar265 + auVar218._4_4_ * fVar241 * 12.0 + fVar162 * fVar241 * 6.0)
              * 0.16666667;
    fVar287 = (fVar313 * 4.0 + fVar287 + auVar218._8_4_ * fVar243 * 12.0 + fVar166 * fVar243 * 6.0)
              * 0.16666667;
    fVar290 = (fVar315 * 4.0 + fVar290 + auVar218._12_4_ * fVar264 * 12.0 + fVar201 * fVar264 * 6.0)
              * 0.16666667;
    fVar293 = (fVar317 * 4.0 + fVar293 + auVar218._16_4_ * fVar267 * 12.0 + fVar222 * fVar267 * 6.0)
              * 0.16666667;
    fVar296 = (fVar319 * 4.0 + fVar296 + auVar218._20_4_ * fVar268 * 12.0 + fVar223 * fVar268 * 6.0)
              * 0.16666667;
    fVar299 = (fVar321 * 4.0 + fVar299 + auVar218._24_4_ * fVar270 * 12.0 + fVar224 * fVar270 * 6.0)
              * 0.16666667;
    fVar302 = fVar302 * 0.16666667;
    fVar312 = fVar312 * 0.16666667;
    fVar313 = fVar313 * 0.16666667;
    fVar315 = fVar315 * 0.16666667;
    fVar317 = fVar317 * 0.16666667;
    fVar319 = fVar319 * 0.16666667;
    fVar321 = fVar321 * 0.16666667;
    fVar378 = auVar371._28_4_ + 12.0;
    fVar359 = fVar358 + 12.166667;
    local_860 = (float)local_1e0._0_4_ * fVar251 +
                fVar323 * (float)local_260._0_4_ +
                fVar302 * (float)local_3e0._0_4_ + fVar245 * (float)local_360._0_4_;
    fStack_85c = (float)local_1e0._4_4_ * fVar266 +
                 fVar332 * (float)local_260._4_4_ +
                 fVar312 * (float)local_3e0._4_4_ + fVar265 * (float)local_360._4_4_;
    fStack_858 = fStack_1d8 * fVar288 +
                 fVar333 * fStack_258 + fVar313 * fStack_3d8 + fVar287 * fStack_358;
    fStack_854 = fStack_1d4 * fVar291 +
                 fVar334 * fStack_254 + fVar315 * fStack_3d4 + fVar290 * fStack_354;
    fStack_850 = fStack_1d0 * fVar294 +
                 fVar335 * fStack_250 + fVar317 * fStack_3d0 + fVar293 * fStack_350;
    fStack_84c = fStack_1cc * fVar297 +
                 fVar336 * fStack_24c + fVar319 * fStack_3cc + fVar296 * fStack_34c;
    fStack_848 = fStack_1c8 * fVar300 +
                 fVar337 * fStack_248 + fVar321 * fStack_3c8 + fVar299 * fStack_348;
    fStack_844 = fVar338 + fVar359;
    fVar138 = (float)local_200._0_4_ * fVar251 +
              (float)local_280._0_4_ * fVar323 +
              fVar302 * (float)local_400._0_4_ + fVar245 * (float)local_380._0_4_;
    fVar160 = (float)local_200._4_4_ * fVar266 +
              (float)local_280._4_4_ * fVar332 +
              fVar312 * (float)local_400._4_4_ + fVar265 * (float)local_380._4_4_;
    fVar164 = fStack_1f8 * fVar288 +
              fStack_278 * fVar333 + fVar313 * fStack_3f8 + fVar287 * fStack_378;
    fVar169 = fStack_1f4 * fVar291 +
              fStack_274 * fVar334 + fVar315 * fStack_3f4 + fVar290 * fStack_374;
    fVar171 = fStack_1f0 * fVar294 +
              fStack_270 * fVar335 + fVar317 * fStack_3f0 + fVar293 * fStack_370;
    fVar172 = fStack_1ec * fVar297 +
              fStack_26c * fVar336 + fVar319 * fStack_3ec + fVar296 * fStack_36c;
    fVar173 = fStack_1e8 * fVar300 +
              fStack_268 * fVar337 + fVar321 * fStack_3e8 + fVar299 * fStack_368;
    fVar174 = fVar338 + fVar378 + 12.166667;
    fVar139 = (float)local_220._0_4_ * fVar251 +
              (float)local_2a0._0_4_ * fVar323 +
              fVar302 * (float)local_420._0_4_ + fVar245 * (float)local_3a0._0_4_;
    fVar161 = (float)local_220._4_4_ * fVar266 +
              (float)local_2a0._4_4_ * fVar332 +
              fVar312 * (float)local_420._4_4_ + fVar265 * (float)local_3a0._4_4_;
    fVar165 = fStack_218 * fVar288 +
              fStack_298 * fVar333 + fVar313 * fStack_418 + fVar287 * fStack_398;
    fVar170 = fStack_214 * fVar291 +
              fStack_294 * fVar334 + fVar315 * fStack_414 + fVar290 * fStack_394;
    fStack_830 = fStack_210 * fVar294 +
                 fStack_290 * fVar335 + fVar317 * fStack_410 + fVar293 * fStack_390;
    fStack_82c = fStack_20c * fVar297 +
                 fStack_28c * fVar336 + fVar319 * fStack_40c + fVar296 * fStack_38c;
    fStack_828 = fStack_208 * fVar300 +
                 fStack_288 * fVar337 + fVar321 * fStack_408 + fVar299 * fStack_388;
    fStack_824 = fVar338 + fVar378 + auVar383._28_4_ + 12.0;
    local_aa0._0_4_ =
         (float)local_240._0_4_ * fVar251 +
         fVar323 * (float)local_340._0_4_ +
         fVar245 * (float)local_3c0._0_4_ + fVar302 * (float)local_440._0_4_;
    local_aa0._4_4_ =
         (float)local_240._4_4_ * fVar266 +
         fVar332 * (float)local_340._4_4_ +
         fVar265 * (float)local_3c0._4_4_ + fVar312 * (float)local_440._4_4_;
    fStack_a98 = fStack_238 * fVar288 +
                 fVar333 * fStack_338 + fVar287 * fStack_3b8 + fVar313 * fStack_438;
    fStack_a94 = fStack_234 * fVar291 +
                 fVar334 * fStack_334 + fVar290 * fStack_3b4 + fVar315 * fStack_434;
    fStack_a90 = fStack_230 * fVar294 +
                 fVar335 * fStack_330 + fVar293 * fStack_3b0 + fVar317 * fStack_430;
    fStack_a8c = fStack_22c * fVar297 +
                 fVar336 * fStack_32c + fVar296 * fStack_3ac + fVar319 * fStack_42c;
    fStack_a88 = fStack_228 * fVar300 +
                 fVar337 * fStack_328 + fVar299 * fStack_3a8 + fVar321 * fStack_428;
    fStack_a84 = auVar285._28_4_ + fVar338 + fVar358 + auVar311._28_4_;
    auVar31._4_4_ = auVar218._4_4_ * -auVar218._4_4_;
    auVar31._0_4_ = auVar218._0_4_ * -auVar218._0_4_;
    auVar31._8_4_ = auVar218._8_4_ * -auVar218._8_4_;
    auVar31._12_4_ = auVar218._12_4_ * -auVar218._12_4_;
    auVar31._16_4_ = auVar218._16_4_ * -auVar218._16_4_;
    auVar31._20_4_ = auVar218._20_4_ * -auVar218._20_4_;
    auVar31._24_4_ = auVar218._24_4_ * -auVar218._24_4_;
    auVar31._28_4_ = auVar218._28_4_;
    auVar30._4_4_ = fVar241 * 4.0;
    auVar30._0_4_ = fVar225 * 4.0;
    auVar30._8_4_ = fVar243 * 4.0;
    auVar30._12_4_ = fVar264 * 4.0;
    auVar30._16_4_ = fVar267 * 4.0;
    auVar30._20_4_ = fVar268 * 4.0;
    auVar30._24_4_ = fVar270 * 4.0;
    auVar30._28_4_ = fVar101;
    auVar118 = vsubps_avx(auVar31,auVar30);
    fVar299 = fVar140 * -fVar140 * 0.5;
    fVar300 = fVar162 * -fVar162 * 0.5;
    fVar302 = fVar166 * -fVar166 * 0.5;
    fVar312 = fVar201 * -fVar201 * 0.5;
    fVar313 = fVar222 * -fVar222 * 0.5;
    fVar315 = fVar223 * -fVar223 * 0.5;
    fVar317 = fVar224 * -fVar224 * 0.5;
    fVar265 = auVar118._0_4_ * 0.5;
    fVar266 = auVar118._4_4_ * 0.5;
    fVar290 = auVar118._8_4_ * 0.5;
    fVar293 = auVar118._12_4_ * 0.5;
    fVar294 = auVar118._16_4_ * 0.5;
    fVar296 = auVar118._20_4_ * 0.5;
    fVar297 = auVar118._24_4_ * 0.5;
    fVar245 = (fVar140 * fVar140 + fVar225 * 4.0) * 0.5;
    fVar251 = (fVar162 * fVar162 + fVar241 * 4.0) * 0.5;
    fVar287 = (fVar166 * fVar166 + fVar243 * 4.0) * 0.5;
    fVar288 = (fVar201 * fVar201 + fVar264 * 4.0) * 0.5;
    fVar267 = (fVar222 * fVar222 + fVar267 * 4.0) * 0.5;
    fVar268 = (fVar223 * fVar223 + fVar268 * 4.0) * 0.5;
    fVar270 = (fVar224 * fVar224 + fVar270 * 4.0) * 0.5;
    fVar140 = auVar218._0_4_ * auVar218._0_4_ * 0.5;
    fVar162 = auVar218._4_4_ * auVar218._4_4_ * 0.5;
    fVar166 = auVar218._8_4_ * auVar218._8_4_ * 0.5;
    fVar201 = auVar218._12_4_ * auVar218._12_4_ * 0.5;
    fVar225 = auVar218._16_4_ * auVar218._16_4_ * 0.5;
    fVar241 = auVar218._20_4_ * auVar218._20_4_ * 0.5;
    fVar243 = auVar218._24_4_ * auVar218._24_4_ * 0.5;
    fVar291 = auVar118._28_4_ + fVar200 + fVar101 + fVar359 + fVar101;
    auVar208 = vpermilps_avx(ZEXT416((uint)(auVar112._0_4_ * 0.04761905)),0);
    fVar222 = auVar208._0_4_;
    fVar379 = fVar222 * ((float)local_1e0._0_4_ * fVar299 +
                        (float)local_260._0_4_ * fVar265 +
                        fVar245 * (float)local_360._0_4_ + fVar140 * (float)local_3e0._0_4_);
    fVar223 = auVar208._4_4_;
    fVar384 = fVar223 * ((float)local_1e0._4_4_ * fVar300 +
                        (float)local_260._4_4_ * fVar266 +
                        fVar251 * (float)local_360._4_4_ + fVar162 * (float)local_3e0._4_4_);
    local_9e0._4_4_ = fVar384;
    local_9e0._0_4_ = fVar379;
    fVar224 = auVar208._8_4_;
    fVar385 = fVar224 * (fStack_1d8 * fVar302 +
                        fStack_258 * fVar290 + fVar287 * fStack_358 + fVar166 * fStack_3d8);
    local_9e0._8_4_ = fVar385;
    fVar264 = auVar208._12_4_;
    fVar386 = fVar264 * (fStack_1d4 * fVar312 +
                        fStack_254 * fVar293 + fVar288 * fStack_354 + fVar201 * fStack_3d4);
    local_9e0._12_4_ = fVar386;
    fVar387 = fVar222 * (fStack_1d0 * fVar313 +
                        fStack_250 * fVar294 + fVar267 * fStack_350 + fVar225 * fStack_3d0);
    local_9e0._16_4_ = fVar387;
    fVar388 = fVar223 * (fStack_1cc * fVar315 +
                        fStack_24c * fVar296 + fVar268 * fStack_34c + fVar241 * fStack_3cc);
    local_9e0._20_4_ = fVar388;
    fVar389 = fVar224 * (fStack_1c8 * fVar317 +
                        fStack_248 * fVar297 + fVar270 * fStack_348 + fVar243 * fStack_3c8);
    local_9e0._24_4_ = fVar389;
    local_9e0._28_4_ = uStack_1c4;
    fVar368 = fVar222 * ((float)local_200._0_4_ * fVar299 +
                        (float)local_280._0_4_ * fVar265 +
                        fVar245 * (float)local_380._0_4_ + fVar140 * (float)local_400._0_4_);
    fVar372 = fVar223 * ((float)local_200._4_4_ * fVar300 +
                        (float)local_280._4_4_ * fVar266 +
                        fVar251 * (float)local_380._4_4_ + fVar162 * (float)local_400._4_4_);
    local_a00._4_4_ = fVar372;
    local_a00._0_4_ = fVar368;
    fVar373 = fVar224 * (fStack_1f8 * fVar302 +
                        fStack_278 * fVar290 + fVar287 * fStack_378 + fVar166 * fStack_3f8);
    local_a00._8_4_ = fVar373;
    fVar374 = fVar264 * (fStack_1f4 * fVar312 +
                        fStack_274 * fVar293 + fVar288 * fStack_374 + fVar201 * fStack_3f4);
    local_a00._12_4_ = fVar374;
    fVar375 = fVar222 * (fStack_1f0 * fVar313 +
                        fStack_270 * fVar294 + fVar267 * fStack_370 + fVar225 * fStack_3f0);
    local_a00._16_4_ = fVar375;
    fVar376 = fVar223 * (fStack_1ec * fVar315 +
                        fStack_26c * fVar296 + fVar268 * fStack_36c + fVar241 * fStack_3ec);
    local_a00._20_4_ = fVar376;
    fVar377 = fVar224 * (fStack_1e8 * fVar317 +
                        fStack_268 * fVar297 + fVar270 * fStack_368 + fVar243 * fStack_3e8);
    local_a00._24_4_ = fVar377;
    local_a00._28_4_ = uStack_224;
    fVar339 = fVar222 * ((float)local_220._0_4_ * fVar299 +
                        fVar140 * (float)local_420._0_4_ + fVar245 * (float)local_3a0._0_4_ +
                        (float)local_2a0._0_4_ * fVar265);
    fVar346 = fVar223 * ((float)local_220._4_4_ * fVar300 +
                        fVar162 * (float)local_420._4_4_ + fVar251 * (float)local_3a0._4_4_ +
                        (float)local_2a0._4_4_ * fVar266);
    local_a20._4_4_ = fVar346;
    local_a20._0_4_ = fVar339;
    fVar348 = fVar224 * (fStack_218 * fVar302 +
                        fVar166 * fStack_418 + fVar287 * fStack_398 + fStack_298 * fVar290);
    local_a20._8_4_ = fVar348;
    fVar350 = fVar264 * (fStack_214 * fVar312 +
                        fVar201 * fStack_414 + fVar288 * fStack_394 + fStack_294 * fVar293);
    local_a20._12_4_ = fVar350;
    fVar352 = fVar222 * (fStack_210 * fVar313 +
                        fVar225 * fStack_410 + fVar267 * fStack_390 + fStack_290 * fVar294);
    local_a20._16_4_ = fVar352;
    fVar354 = fVar223 * (fStack_20c * fVar315 +
                        fVar241 * fStack_40c + fVar268 * fStack_38c + fStack_28c * fVar296);
    local_a20._20_4_ = fVar354;
    fVar356 = fVar224 * (fStack_208 * fVar317 +
                        fVar243 * fStack_408 + fVar270 * fStack_388 + fStack_288 * fVar297);
    local_a20._24_4_ = fVar356;
    local_a20._28_4_ = fVar359;
    fVar265 = fVar222 * ((float)local_240._0_4_ * fVar299 +
                        fVar265 * (float)local_340._0_4_ +
                        fVar140 * (float)local_440._0_4_ + fVar245 * (float)local_3c0._0_4_);
    fVar266 = fVar223 * ((float)local_240._4_4_ * fVar300 +
                        fVar266 * (float)local_340._4_4_ +
                        fVar162 * (float)local_440._4_4_ + fVar251 * (float)local_3c0._4_4_);
    auVar188._4_4_ = fVar266;
    auVar188._0_4_ = fVar265;
    fVar290 = fVar224 * (fStack_238 * fVar302 +
                        fVar290 * fStack_338 + fVar166 * fStack_438 + fVar287 * fStack_3b8);
    auVar188._8_4_ = fVar290;
    fVar264 = fVar264 * (fStack_234 * fVar312 +
                        fVar293 * fStack_334 + fVar201 * fStack_434 + fVar288 * fStack_3b4);
    auVar188._12_4_ = fVar264;
    fVar222 = fVar222 * (fStack_230 * fVar313 +
                        fVar294 * fStack_330 + fVar225 * fStack_430 + fVar267 * fStack_3b0);
    auVar188._16_4_ = fVar222;
    fVar223 = fVar223 * (fStack_22c * fVar315 +
                        fVar296 * fStack_32c + fVar241 * fStack_42c + fVar268 * fStack_3ac);
    auVar188._20_4_ = fVar223;
    fVar224 = fVar224 * (fStack_228 * fVar317 +
                        fVar297 * fStack_328 + fVar243 * fStack_428 + fVar270 * fStack_3a8);
    auVar188._24_4_ = fVar224;
    auVar188._28_4_ = fVar291;
    auVar80._4_4_ = fVar160;
    auVar80._0_4_ = fVar138;
    auVar80._8_4_ = fVar164;
    auVar80._12_4_ = fVar169;
    auVar80._16_4_ = fVar171;
    auVar80._20_4_ = fVar172;
    auVar80._24_4_ = fVar173;
    auVar80._28_4_ = fVar174;
    auVar118 = vperm2f128_avx(auVar80,auVar80,1);
    auVar118 = vshufps_avx(auVar118,auVar80,0x30);
    auVar30 = vshufps_avx(auVar80,auVar118,0x29);
    auVar85._4_4_ = fVar161;
    auVar85._0_4_ = fVar139;
    auVar85._8_4_ = fVar165;
    auVar85._12_4_ = fVar170;
    auVar85._16_4_ = fStack_830;
    auVar85._20_4_ = fStack_82c;
    auVar85._24_4_ = fStack_828;
    auVar85._28_4_ = fStack_824;
    auVar118 = vperm2f128_avx(auVar85,auVar85,1);
    auVar118 = vshufps_avx(auVar118,auVar85,0x30);
    auVar218 = vshufps_avx(auVar85,auVar118,0x29);
    auVar119 = vsubps_avx(_local_aa0,auVar188);
    auVar118 = vperm2f128_avx(auVar119,auVar119,1);
    auVar118 = vshufps_avx(auVar118,auVar119,0x30);
    auVar188 = vshufps_avx(auVar119,auVar118,0x29);
    auVar31 = vsubps_avx(auVar30,auVar80);
    auVar32 = vsubps_avx(auVar218,auVar85);
    fVar140 = auVar31._0_4_;
    fVar241 = auVar31._4_4_;
    auVar34._4_4_ = fVar346 * fVar241;
    auVar34._0_4_ = fVar339 * fVar140;
    fVar288 = auVar31._8_4_;
    auVar34._8_4_ = fVar348 * fVar288;
    fVar296 = auVar31._12_4_;
    auVar34._12_4_ = fVar350 * fVar296;
    fVar317 = auVar31._16_4_;
    auVar34._16_4_ = fVar352 * fVar317;
    fVar336 = auVar31._20_4_;
    auVar34._20_4_ = fVar354 * fVar336;
    fVar20 = auVar31._24_4_;
    auVar34._24_4_ = fVar356 * fVar20;
    auVar34._28_4_ = auVar119._28_4_;
    fVar162 = auVar32._0_4_;
    fVar243 = auVar32._4_4_;
    auVar33._4_4_ = fVar372 * fVar243;
    auVar33._0_4_ = fVar368 * fVar162;
    fVar267 = auVar32._8_4_;
    auVar33._8_4_ = fVar373 * fVar267;
    fVar297 = auVar32._12_4_;
    auVar33._12_4_ = fVar374 * fVar297;
    fVar319 = auVar32._16_4_;
    auVar33._16_4_ = fVar375 * fVar319;
    fVar337 = auVar32._20_4_;
    auVar33._20_4_ = fVar376 * fVar337;
    fVar21 = auVar32._24_4_;
    auVar33._24_4_ = fVar377 * fVar21;
    auVar33._28_4_ = auVar118._28_4_;
    auVar31 = vsubps_avx(auVar33,auVar34);
    auVar82._4_4_ = fStack_85c;
    auVar82._0_4_ = local_860;
    auVar82._8_4_ = fStack_858;
    auVar82._12_4_ = fStack_854;
    auVar82._16_4_ = fStack_850;
    auVar82._20_4_ = fStack_84c;
    auVar82._24_4_ = fStack_848;
    auVar82._28_4_ = fStack_844;
    auVar118 = vperm2f128_avx(auVar82,auVar82,1);
    auVar118 = vshufps_avx(auVar118,auVar82,0x30);
    local_6c0 = vshufps_avx(auVar82,auVar118,0x29);
    auVar33 = vsubps_avx(local_6c0,auVar82);
    auVar35._4_4_ = fVar384 * fVar243;
    auVar35._0_4_ = fVar379 * fVar162;
    auVar35._8_4_ = fVar385 * fVar267;
    auVar35._12_4_ = fVar386 * fVar297;
    auVar35._16_4_ = fVar387 * fVar319;
    auVar35._20_4_ = fVar388 * fVar337;
    auVar35._24_4_ = fVar389 * fVar21;
    auVar35._28_4_ = local_6c0._28_4_;
    fVar166 = auVar33._0_4_;
    fVar245 = auVar33._4_4_;
    auVar36._4_4_ = fVar346 * fVar245;
    auVar36._0_4_ = fVar339 * fVar166;
    fVar268 = auVar33._8_4_;
    auVar36._8_4_ = fVar348 * fVar268;
    fVar299 = auVar33._12_4_;
    auVar36._12_4_ = fVar350 * fVar299;
    fVar321 = auVar33._16_4_;
    auVar36._16_4_ = fVar352 * fVar321;
    fVar338 = auVar33._20_4_;
    auVar36._20_4_ = fVar354 * fVar338;
    fVar22 = auVar33._24_4_;
    auVar36._24_4_ = fVar356 * fVar22;
    auVar36._28_4_ = auVar30._28_4_;
    auVar34 = vsubps_avx(auVar36,auVar35);
    auVar37._4_4_ = fVar372 * fVar245;
    auVar37._0_4_ = fVar368 * fVar166;
    auVar37._8_4_ = fVar373 * fVar268;
    auVar37._12_4_ = fVar374 * fVar299;
    auVar37._16_4_ = fVar375 * fVar321;
    auVar37._20_4_ = fVar376 * fVar338;
    auVar37._24_4_ = fVar377 * fVar22;
    auVar37._28_4_ = auVar30._28_4_;
    auVar240._4_4_ = fVar384 * fVar241;
    auVar240._0_4_ = fVar379 * fVar140;
    auVar240._8_4_ = fVar385 * fVar288;
    auVar240._12_4_ = fVar386 * fVar296;
    auVar240._16_4_ = fVar387 * fVar317;
    auVar240._20_4_ = fVar388 * fVar336;
    auVar240._24_4_ = fVar389 * fVar20;
    auVar240._28_4_ = uStack_204;
    auVar35 = vsubps_avx(auVar240,auVar37);
    fVar101 = auVar35._28_4_;
    auVar151._0_4_ = fVar166 * fVar166 + fVar140 * fVar140 + fVar162 * fVar162;
    auVar151._4_4_ = fVar245 * fVar245 + fVar241 * fVar241 + fVar243 * fVar243;
    auVar151._8_4_ = fVar268 * fVar268 + fVar288 * fVar288 + fVar267 * fVar267;
    auVar151._12_4_ = fVar299 * fVar299 + fVar296 * fVar296 + fVar297 * fVar297;
    auVar151._16_4_ = fVar321 * fVar321 + fVar317 * fVar317 + fVar319 * fVar319;
    auVar151._20_4_ = fVar338 * fVar338 + fVar336 * fVar336 + fVar337 * fVar337;
    auVar151._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar151._28_4_ = fVar101 + fVar101 + auVar31._28_4_;
    auVar118 = vrcpps_avx(auVar151);
    fVar293 = auVar118._0_4_;
    fVar294 = auVar118._4_4_;
    auVar38._4_4_ = fVar294 * auVar151._4_4_;
    auVar38._0_4_ = fVar293 * auVar151._0_4_;
    fVar302 = auVar118._8_4_;
    auVar38._8_4_ = fVar302 * auVar151._8_4_;
    fVar312 = auVar118._12_4_;
    auVar38._12_4_ = fVar312 * auVar151._12_4_;
    fVar313 = auVar118._16_4_;
    auVar38._16_4_ = fVar313 * auVar151._16_4_;
    fVar315 = auVar118._20_4_;
    auVar38._20_4_ = fVar315 * auVar151._20_4_;
    fVar332 = auVar118._24_4_;
    auVar38._24_4_ = fVar332 * auVar151._24_4_;
    auVar38._28_4_ = uStack_204;
    auVar120._8_4_ = 0x3f800000;
    auVar120._0_8_ = 0x3f8000003f800000;
    auVar120._12_4_ = 0x3f800000;
    auVar120._16_4_ = 0x3f800000;
    auVar120._20_4_ = 0x3f800000;
    auVar120._24_4_ = 0x3f800000;
    auVar120._28_4_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar120,auVar38);
    fVar293 = auVar36._0_4_ * fVar293 + fVar293;
    fVar294 = auVar36._4_4_ * fVar294 + fVar294;
    fVar302 = auVar36._8_4_ * fVar302 + fVar302;
    fVar312 = auVar36._12_4_ * fVar312 + fVar312;
    fVar313 = auVar36._16_4_ * fVar313 + fVar313;
    fVar315 = auVar36._20_4_ * fVar315 + fVar315;
    fVar332 = auVar36._24_4_ * fVar332 + fVar332;
    auVar119 = vperm2f128_avx(local_a00,local_a00,1);
    auVar119 = vshufps_avx(auVar119,local_a00,0x30);
    local_880 = vshufps_avx(local_a00,auVar119,0x29);
    auVar119 = vperm2f128_avx(local_a20,local_a20,1);
    auVar119 = vshufps_avx(auVar119,local_a20,0x30);
    local_700 = vshufps_avx(local_a20,auVar119,0x29);
    fVar201 = local_700._0_4_;
    fVar251 = local_700._4_4_;
    auVar39._4_4_ = fVar241 * fVar251;
    auVar39._0_4_ = fVar140 * fVar201;
    fVar270 = local_700._8_4_;
    auVar39._8_4_ = fVar288 * fVar270;
    fVar300 = local_700._12_4_;
    auVar39._12_4_ = fVar296 * fVar300;
    fVar323 = local_700._16_4_;
    auVar39._16_4_ = fVar317 * fVar323;
    fVar358 = local_700._20_4_;
    auVar39._20_4_ = fVar336 * fVar358;
    fVar23 = local_700._24_4_;
    auVar39._24_4_ = fVar20 * fVar23;
    auVar39._28_4_ = auVar119._28_4_;
    fVar390 = local_880._0_4_;
    fVar395 = local_880._4_4_;
    auVar309._4_4_ = fVar395 * fVar243;
    auVar309._0_4_ = fVar390 * fVar162;
    fVar396 = local_880._8_4_;
    auVar309._8_4_ = fVar396 * fVar267;
    fVar397 = local_880._12_4_;
    auVar309._12_4_ = fVar397 * fVar297;
    fVar398 = local_880._16_4_;
    auVar309._16_4_ = fVar398 * fVar319;
    fVar399 = local_880._20_4_;
    auVar309._20_4_ = fVar399 * fVar337;
    fVar400 = local_880._24_4_;
    auVar309._24_4_ = fVar400 * fVar21;
    auVar309._28_4_ = uStack_224;
    auVar37 = vsubps_avx(auVar309,auVar39);
    auVar119 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar119 = vshufps_avx(auVar119,local_9e0,0x30);
    local_6e0 = vshufps_avx(local_9e0,auVar119,0x29);
    fVar340 = local_6e0._0_4_;
    fVar347 = local_6e0._4_4_;
    auVar40._4_4_ = fVar347 * fVar243;
    auVar40._0_4_ = fVar340 * fVar162;
    fVar349 = local_6e0._8_4_;
    auVar40._8_4_ = fVar349 * fVar267;
    fVar351 = local_6e0._12_4_;
    auVar40._12_4_ = fVar351 * fVar297;
    fVar353 = local_6e0._16_4_;
    auVar40._16_4_ = fVar353 * fVar319;
    fVar355 = local_6e0._20_4_;
    auVar40._20_4_ = fVar355 * fVar337;
    fVar357 = local_6e0._24_4_;
    auVar40._24_4_ = fVar357 * fVar21;
    auVar40._28_4_ = auVar119._28_4_;
    auVar41._4_4_ = fVar251 * fVar245;
    auVar41._0_4_ = fVar201 * fVar166;
    auVar41._8_4_ = fVar270 * fVar268;
    auVar41._12_4_ = fVar300 * fVar299;
    auVar41._16_4_ = fVar323 * fVar321;
    auVar41._20_4_ = fVar358 * fVar338;
    auVar41._24_4_ = fVar23 * fVar22;
    auVar41._28_4_ = uStack_1c4;
    auVar240 = vsubps_avx(auVar41,auVar40);
    auVar42._4_4_ = fVar395 * fVar245;
    auVar42._0_4_ = fVar390 * fVar166;
    auVar42._8_4_ = fVar396 * fVar268;
    auVar42._12_4_ = fVar397 * fVar299;
    auVar42._16_4_ = fVar398 * fVar321;
    auVar42._20_4_ = fVar399 * fVar338;
    auVar42._24_4_ = fVar400 * fVar22;
    auVar42._28_4_ = uStack_1c4;
    auVar43._4_4_ = fVar347 * fVar241;
    auVar43._0_4_ = fVar340 * fVar140;
    auVar43._8_4_ = fVar349 * fVar288;
    auVar43._12_4_ = fVar351 * fVar296;
    auVar43._16_4_ = fVar353 * fVar317;
    auVar43._20_4_ = fVar355 * fVar336;
    fVar225 = local_880._28_4_;
    auVar43._24_4_ = fVar357 * fVar20;
    auVar43._28_4_ = fVar225;
    auVar119 = vsubps_avx(auVar43,auVar42);
    fVar287 = auVar119._28_4_;
    auVar44._4_4_ =
         (auVar31._4_4_ * auVar31._4_4_ +
         auVar34._4_4_ * auVar34._4_4_ + auVar35._4_4_ * auVar35._4_4_) * fVar294;
    auVar44._0_4_ =
         (auVar31._0_4_ * auVar31._0_4_ +
         auVar34._0_4_ * auVar34._0_4_ + auVar35._0_4_ * auVar35._0_4_) * fVar293;
    auVar44._8_4_ =
         (auVar31._8_4_ * auVar31._8_4_ +
         auVar34._8_4_ * auVar34._8_4_ + auVar35._8_4_ * auVar35._8_4_) * fVar302;
    auVar44._12_4_ =
         (auVar31._12_4_ * auVar31._12_4_ +
         auVar34._12_4_ * auVar34._12_4_ + auVar35._12_4_ * auVar35._12_4_) * fVar312;
    auVar44._16_4_ =
         (auVar31._16_4_ * auVar31._16_4_ +
         auVar34._16_4_ * auVar34._16_4_ + auVar35._16_4_ * auVar35._16_4_) * fVar313;
    auVar44._20_4_ =
         (auVar31._20_4_ * auVar31._20_4_ +
         auVar34._20_4_ * auVar34._20_4_ + auVar35._20_4_ * auVar35._20_4_) * fVar315;
    auVar44._24_4_ =
         (auVar31._24_4_ * auVar31._24_4_ +
         auVar34._24_4_ * auVar34._24_4_ + auVar35._24_4_ * auVar35._24_4_) * fVar332;
    auVar44._28_4_ = auVar31._28_4_ + auVar34._28_4_ + fVar101;
    auVar45._4_4_ =
         (auVar37._4_4_ * auVar37._4_4_ +
         auVar240._4_4_ * auVar240._4_4_ + auVar119._4_4_ * auVar119._4_4_) * fVar294;
    auVar45._0_4_ =
         (auVar37._0_4_ * auVar37._0_4_ +
         auVar240._0_4_ * auVar240._0_4_ + auVar119._0_4_ * auVar119._0_4_) * fVar293;
    auVar45._8_4_ =
         (auVar37._8_4_ * auVar37._8_4_ +
         auVar240._8_4_ * auVar240._8_4_ + auVar119._8_4_ * auVar119._8_4_) * fVar302;
    auVar45._12_4_ =
         (auVar37._12_4_ * auVar37._12_4_ +
         auVar240._12_4_ * auVar240._12_4_ + auVar119._12_4_ * auVar119._12_4_) * fVar312;
    auVar45._16_4_ =
         (auVar37._16_4_ * auVar37._16_4_ +
         auVar240._16_4_ * auVar240._16_4_ + auVar119._16_4_ * auVar119._16_4_) * fVar313;
    auVar45._20_4_ =
         (auVar37._20_4_ * auVar37._20_4_ +
         auVar240._20_4_ * auVar240._20_4_ + auVar119._20_4_ * auVar119._20_4_) * fVar315;
    auVar45._24_4_ =
         (auVar37._24_4_ * auVar37._24_4_ +
         auVar240._24_4_ * auVar240._24_4_ + auVar119._24_4_ * auVar119._24_4_) * fVar332;
    auVar45._28_4_ = auVar36._28_4_ + auVar118._28_4_;
    auVar118 = vmaxps_avx(auVar44,auVar45);
    auVar119 = vperm2f128_avx(_local_aa0,_local_aa0,1);
    auVar119 = vshufps_avx(auVar119,_local_aa0,0x30);
    auVar34 = vshufps_avx(_local_aa0,auVar119,0x29);
    auVar121._0_4_ = (float)local_aa0._0_4_ + fVar265;
    auVar121._4_4_ = (float)local_aa0._4_4_ + fVar266;
    auVar121._8_4_ = fStack_a98 + fVar290;
    auVar121._12_4_ = fStack_a94 + fVar264;
    auVar121._16_4_ = fStack_a90 + fVar222;
    auVar121._20_4_ = fStack_a8c + fVar223;
    auVar121._24_4_ = fStack_a88 + fVar224;
    auVar121._28_4_ = fStack_a84 + fVar291;
    auVar119 = vmaxps_avx(_local_aa0,auVar121);
    auVar31 = vmaxps_avx(auVar188,auVar34);
    auVar119 = vmaxps_avx(auVar119,auVar31);
    auVar31 = vrsqrtps_avx(auVar151);
    fVar101 = auVar31._0_4_;
    fVar222 = auVar31._4_4_;
    fVar223 = auVar31._8_4_;
    fVar224 = auVar31._12_4_;
    fVar264 = auVar31._16_4_;
    fVar265 = auVar31._20_4_;
    fVar266 = auVar31._24_4_;
    auVar46._4_4_ = fVar222 * fVar222 * fVar222 * auVar151._4_4_ * 0.5;
    auVar46._0_4_ = fVar101 * fVar101 * fVar101 * auVar151._0_4_ * 0.5;
    auVar46._8_4_ = fVar223 * fVar223 * fVar223 * auVar151._8_4_ * 0.5;
    auVar46._12_4_ = fVar224 * fVar224 * fVar224 * auVar151._12_4_ * 0.5;
    auVar46._16_4_ = fVar264 * fVar264 * fVar264 * auVar151._16_4_ * 0.5;
    auVar46._20_4_ = fVar265 * fVar265 * fVar265 * auVar151._20_4_ * 0.5;
    auVar46._24_4_ = fVar266 * fVar266 * fVar266 * auVar151._24_4_ * 0.5;
    auVar46._28_4_ = auVar151._28_4_;
    auVar47._4_4_ = fVar222 * 1.5;
    auVar47._0_4_ = fVar101 * 1.5;
    auVar47._8_4_ = fVar223 * 1.5;
    auVar47._12_4_ = fVar224 * 1.5;
    auVar47._16_4_ = fVar264 * 1.5;
    auVar47._20_4_ = fVar265 * 1.5;
    auVar47._24_4_ = fVar266 * 1.5;
    auVar47._28_4_ = auVar31._28_4_;
    local_300 = vsubps_avx(auVar47,auVar46);
    auVar81._4_4_ = fVar160;
    auVar81._0_4_ = fVar138;
    auVar81._8_4_ = fVar164;
    auVar81._12_4_ = fVar169;
    auVar81._16_4_ = fVar171;
    auVar81._20_4_ = fVar172;
    auVar81._24_4_ = fVar173;
    auVar81._28_4_ = fVar174;
    _local_a40 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    local_720 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar222 = local_720._0_4_;
    fVar264 = local_720._4_4_;
    fVar290 = local_720._8_4_;
    fVar302 = local_720._12_4_;
    fVar332 = local_720._16_4_;
    fVar359 = local_720._20_4_;
    fVar24 = local_720._24_4_;
    fVar223 = local_a40._0_4_;
    fVar265 = local_a40._4_4_;
    fVar291 = local_a40._8_4_;
    fVar312 = local_a40._12_4_;
    fVar333 = local_a40._16_4_;
    fVar378 = local_a40._20_4_;
    fVar25 = local_a40._24_4_;
    auVar35 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
    fVar224 = auVar35._0_4_;
    fVar266 = auVar35._4_4_;
    fVar293 = auVar35._8_4_;
    fVar313 = auVar35._12_4_;
    fVar334 = auVar35._16_4_;
    fVar19 = auVar35._20_4_;
    fVar26 = auVar35._24_4_;
    auVar361._0_4_ = local_560 * fVar224 + local_760 * fVar223 + local_780 * fVar222;
    auVar361._4_4_ = fStack_55c * fVar266 + fStack_75c * fVar265 + fStack_77c * fVar264;
    auVar361._8_4_ = fStack_558 * fVar293 + fStack_758 * fVar291 + fStack_778 * fVar290;
    auVar361._12_4_ = fStack_554 * fVar313 + fStack_754 * fVar312 + fStack_774 * fVar302;
    auVar361._16_4_ = fStack_550 * fVar334 + fStack_750 * fVar333 + fStack_770 * fVar332;
    auVar361._20_4_ = fStack_54c * fVar19 + fStack_74c * fVar378 + fStack_76c * fVar359;
    auVar361._24_4_ = fStack_548 * fVar26 + fStack_748 * fVar25 + fStack_768 * fVar24;
    auVar361._28_4_ = fVar287 + auVar37._28_4_ + auVar240._28_4_ + fVar287 + auVar31._28_4_;
    auVar381._0_4_ = fVar224 * fVar224 + fVar223 * fVar223 + fVar222 * fVar222;
    auVar381._4_4_ = fVar266 * fVar266 + fVar265 * fVar265 + fVar264 * fVar264;
    auVar381._8_4_ = fVar293 * fVar293 + fVar291 * fVar291 + fVar290 * fVar290;
    auVar381._12_4_ = fVar313 * fVar313 + fVar312 * fVar312 + fVar302 * fVar302;
    auVar381._16_4_ = fVar334 * fVar334 + fVar333 * fVar333 + fVar332 * fVar332;
    auVar381._20_4_ = fVar19 * fVar19 + fVar378 * fVar378 + fVar359 * fVar359;
    auVar381._24_4_ = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
    auVar381._28_4_ = fVar225 + fVar225 + fVar287;
    fVar225 = local_300._0_4_;
    fVar287 = local_300._4_4_;
    fVar294 = local_300._8_4_;
    fVar315 = local_300._12_4_;
    fVar335 = local_300._16_4_;
    fVar269 = local_300._20_4_;
    fVar271 = local_300._24_4_;
    auVar329._8_4_ = 0x3f800000;
    auVar329._0_8_ = 0x3f8000003f800000;
    auVar329._12_4_ = 0x3f800000;
    auVar329._16_4_ = 0x3f800000;
    auVar329._20_4_ = 0x3f800000;
    auVar329._24_4_ = 0x3f800000;
    auVar329._28_4_ = 0x3f800000;
    fVar101 = auVar32._28_4_;
    auVar345 = ZEXT3264(local_300);
    fVar402 = local_560 * fVar166 * fVar225 +
              local_760 * fVar140 * fVar225 + fVar162 * fVar225 * local_780;
    fVar407 = fStack_55c * fVar245 * fVar287 +
              fStack_75c * fVar241 * fVar287 + fVar243 * fVar287 * fStack_77c;
    fVar408 = fStack_558 * fVar268 * fVar294 +
              fStack_758 * fVar288 * fVar294 + fVar267 * fVar294 * fStack_778;
    fVar409 = fStack_554 * fVar299 * fVar315 +
              fStack_754 * fVar296 * fVar315 + fVar297 * fVar315 * fStack_774;
    fVar410 = fStack_550 * fVar321 * fVar335 +
              fStack_750 * fVar317 * fVar335 + fVar319 * fVar335 * fStack_770;
    fVar412 = fStack_54c * fVar338 * fVar269 +
              fStack_74c * fVar336 * fVar269 + fVar337 * fVar269 * fStack_76c;
    fVar414 = fStack_548 * fVar22 * fVar271 +
              fStack_748 * fVar20 * fVar271 + fVar21 * fVar271 * fStack_768;
    fVar272 = local_300._28_4_ + fVar101 + 0.0;
    fVar226 = fVar224 * fVar166 * fVar225 +
              fVar140 * fVar225 * fVar223 + fVar162 * fVar225 * fVar222;
    fVar242 = fVar266 * fVar245 * fVar287 +
              fVar241 * fVar287 * fVar265 + fVar243 * fVar287 * fVar264;
    fVar244 = fVar293 * fVar268 * fVar294 +
              fVar288 * fVar294 * fVar291 + fVar267 * fVar294 * fVar290;
    fVar246 = fVar313 * fVar299 * fVar315 +
              fVar296 * fVar315 * fVar312 + fVar297 * fVar315 * fVar302;
    fVar247 = fVar334 * fVar321 * fVar335 +
              fVar317 * fVar335 * fVar333 + fVar319 * fVar335 * fVar332;
    fVar248 = fVar19 * fVar338 * fVar269 + fVar336 * fVar269 * fVar378 + fVar337 * fVar269 * fVar359
    ;
    fVar249 = fVar26 * fVar22 * fVar271 + fVar20 * fVar271 * fVar25 + fVar21 * fVar271 * fVar24;
    fVar250 = fVar101 + fVar272;
    auVar32._4_4_ = fVar407 * fVar242;
    auVar32._0_4_ = fVar402 * fVar226;
    auVar32._8_4_ = fVar408 * fVar244;
    auVar32._12_4_ = fVar409 * fVar246;
    auVar32._16_4_ = fVar410 * fVar247;
    auVar32._20_4_ = fVar412 * fVar248;
    auVar32._24_4_ = fVar414 * fVar249;
    auVar32._28_4_ = fVar272;
    auVar32 = vsubps_avx(auVar361,auVar32);
    auVar48._4_4_ = fVar242 * fVar242;
    auVar48._0_4_ = fVar226 * fVar226;
    auVar48._8_4_ = fVar244 * fVar244;
    auVar48._12_4_ = fVar246 * fVar246;
    auVar48._16_4_ = fVar247 * fVar247;
    auVar48._20_4_ = fVar248 * fVar248;
    auVar48._24_4_ = fVar249 * fVar249;
    auVar48._28_4_ = fVar101;
    auVar36 = vsubps_avx(auVar381,auVar48);
    auVar31 = vsqrtps_avx(auVar118);
    fVar101 = (auVar119._0_4_ + auVar31._0_4_) * 1.0000002;
    fVar272 = (auVar119._4_4_ + auVar31._4_4_) * 1.0000002;
    fVar132 = (auVar119._8_4_ + auVar31._8_4_) * 1.0000002;
    fVar133 = (auVar119._12_4_ + auVar31._12_4_) * 1.0000002;
    fVar134 = (auVar119._16_4_ + auVar31._16_4_) * 1.0000002;
    fVar135 = (auVar119._20_4_ + auVar31._20_4_) * 1.0000002;
    fVar136 = (auVar119._24_4_ + auVar31._24_4_) * 1.0000002;
    auVar49._4_4_ = fVar272 * fVar272;
    auVar49._0_4_ = fVar101 * fVar101;
    auVar49._8_4_ = fVar132 * fVar132;
    auVar49._12_4_ = fVar133 * fVar133;
    auVar49._16_4_ = fVar134 * fVar134;
    auVar49._20_4_ = fVar135 * fVar135;
    auVar49._24_4_ = fVar136 * fVar136;
    auVar49._28_4_ = auVar119._28_4_ + auVar31._28_4_;
    fVar272 = auVar32._0_4_ + auVar32._0_4_;
    fVar132 = auVar32._4_4_ + auVar32._4_4_;
    local_320._0_8_ = CONCAT44(fVar132,fVar272);
    local_320._8_4_ = auVar32._8_4_ + auVar32._8_4_;
    local_320._12_4_ = auVar32._12_4_ + auVar32._12_4_;
    local_320._16_4_ = auVar32._16_4_ + auVar32._16_4_;
    local_320._20_4_ = auVar32._20_4_ + auVar32._20_4_;
    local_320._24_4_ = auVar32._24_4_ + auVar32._24_4_;
    local_320._28_4_ = auVar32._28_4_ + auVar32._28_4_;
    auVar32 = vsubps_avx(auVar36,auVar49);
    auVar383 = ZEXT3264(auVar32);
    auVar50._4_4_ = fVar407 * fVar407;
    auVar50._0_4_ = fVar402 * fVar402;
    auVar50._8_4_ = fVar408 * fVar408;
    auVar50._12_4_ = fVar409 * fVar409;
    auVar50._16_4_ = fVar410 * fVar410;
    auVar50._20_4_ = fVar412 * fVar412;
    auVar50._24_4_ = fVar414 * fVar414;
    auVar50._28_4_ = auVar119._28_4_;
    local_480 = vsubps_avx(local_2c0,auVar50);
    auVar51._4_4_ = fVar132 * fVar132;
    auVar51._0_4_ = fVar272 * fVar272;
    auVar51._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar51._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar51._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar51._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar51._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar51._28_4_ = local_300._28_4_;
    fVar133 = local_480._0_4_;
    fVar134 = local_480._4_4_;
    fVar135 = local_480._8_4_;
    fVar136 = local_480._12_4_;
    fVar411 = local_480._16_4_;
    fVar413 = local_480._20_4_;
    fVar415 = local_480._24_4_;
    auVar52._4_4_ = auVar32._4_4_ * fVar134 * 4.0;
    auVar52._0_4_ = auVar32._0_4_ * fVar133 * 4.0;
    auVar52._8_4_ = auVar32._8_4_ * fVar135 * 4.0;
    auVar52._12_4_ = auVar32._12_4_ * fVar136 * 4.0;
    auVar52._16_4_ = auVar32._16_4_ * fVar411 * 4.0;
    auVar52._20_4_ = auVar32._20_4_ * fVar413 * 4.0;
    auVar52._24_4_ = auVar32._24_4_ * fVar415 * 4.0;
    auVar52._28_4_ = 0x40800000;
    auVar119 = vsubps_avx(auVar51,auVar52);
    auVar118 = vcmpps_avx(auVar119,ZEXT832(0) << 0x20,5);
    fVar101 = local_480._28_4_;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar118 >> 0x7f,0) == '\0') &&
          (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar118 >> 0xbf,0) == '\0') &&
        (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar118[0x1f])
    {
      auVar392._8_4_ = 0x7f800000;
      auVar392._0_8_ = 0x7f8000007f800000;
      auVar392._12_4_ = 0x7f800000;
      auVar392._16_4_ = 0x7f800000;
      auVar392._20_4_ = 0x7f800000;
      auVar392._24_4_ = 0x7f800000;
      auVar392._28_4_ = 0x7f800000;
      auVar370._8_4_ = 0xff800000;
      auVar370._0_8_ = 0xff800000ff800000;
      auVar370._12_4_ = 0xff800000;
      auVar370._16_4_ = 0xff800000;
      auVar370._20_4_ = 0xff800000;
      auVar370._24_4_ = 0xff800000;
      auVar370._28_4_ = 0xff800000;
      auVar280 = local_2c0;
    }
    else {
      auVar37 = vcmpps_avx(auVar119,ZEXT832(0) << 0x20,5);
      auVar240 = vsqrtps_avx(auVar119);
      auVar279._0_4_ = fVar133 + fVar133;
      auVar279._4_4_ = fVar134 + fVar134;
      auVar279._8_4_ = fVar135 + fVar135;
      auVar279._12_4_ = fVar136 + fVar136;
      auVar279._16_4_ = fVar411 + fVar411;
      auVar279._20_4_ = fVar413 + fVar413;
      auVar279._24_4_ = fVar415 + fVar415;
      auVar279._28_4_ = fVar101 + fVar101;
      auVar119 = vrcpps_avx(auVar279);
      fVar273 = auVar119._0_4_;
      fVar286 = auVar119._4_4_;
      auVar53._4_4_ = auVar279._4_4_ * fVar286;
      auVar53._0_4_ = auVar279._0_4_ * fVar273;
      fVar289 = auVar119._8_4_;
      auVar53._8_4_ = auVar279._8_4_ * fVar289;
      fVar292 = auVar119._12_4_;
      auVar53._12_4_ = auVar279._12_4_ * fVar292;
      fVar295 = auVar119._16_4_;
      auVar53._16_4_ = auVar279._16_4_ * fVar295;
      fVar298 = auVar119._20_4_;
      auVar53._20_4_ = auVar279._20_4_ * fVar298;
      fVar301 = auVar119._24_4_;
      auVar53._24_4_ = auVar279._24_4_ * fVar301;
      auVar53._28_4_ = auVar279._28_4_;
      auVar119 = vsubps_avx(auVar329,auVar53);
      fVar273 = fVar273 + fVar273 * auVar119._0_4_;
      fVar286 = fVar286 + fVar286 * auVar119._4_4_;
      fVar289 = fVar289 + fVar289 * auVar119._8_4_;
      fVar292 = fVar292 + fVar292 * auVar119._12_4_;
      fVar295 = fVar295 + fVar295 * auVar119._16_4_;
      fVar298 = fVar298 + fVar298 * auVar119._20_4_;
      fVar301 = fVar301 + fVar301 * auVar119._24_4_;
      auVar308._0_8_ = CONCAT44(fVar132,fVar272) ^ 0x8000000080000000;
      auVar308._8_4_ = -local_320._8_4_;
      auVar308._12_4_ = -local_320._12_4_;
      auVar308._16_4_ = -local_320._16_4_;
      auVar308._20_4_ = -local_320._20_4_;
      auVar308._24_4_ = -local_320._24_4_;
      auVar308._28_4_ = -local_320._28_4_;
      auVar119 = vsubps_avx(auVar308,auVar240);
      fVar272 = auVar119._0_4_ * fVar273;
      fVar132 = auVar119._4_4_ * fVar286;
      auVar54._4_4_ = fVar132;
      auVar54._0_4_ = fVar272;
      fVar314 = auVar119._8_4_ * fVar289;
      auVar54._8_4_ = fVar314;
      fVar316 = auVar119._12_4_ * fVar292;
      auVar54._12_4_ = fVar316;
      fVar318 = auVar119._16_4_ * fVar295;
      auVar54._16_4_ = fVar318;
      fVar320 = auVar119._20_4_ * fVar298;
      auVar54._20_4_ = fVar320;
      fVar322 = auVar119._24_4_ * fVar301;
      auVar54._24_4_ = fVar322;
      auVar54._28_4_ = auVar119._28_4_;
      auVar119 = vsubps_avx(auVar240,local_320);
      fVar273 = auVar119._0_4_ * fVar273;
      fVar286 = auVar119._4_4_ * fVar286;
      auVar55._4_4_ = fVar286;
      auVar55._0_4_ = fVar273;
      fVar289 = auVar119._8_4_ * fVar289;
      auVar55._8_4_ = fVar289;
      fVar292 = auVar119._12_4_ * fVar292;
      auVar55._12_4_ = fVar292;
      fVar295 = auVar119._16_4_ * fVar295;
      auVar55._16_4_ = fVar295;
      fVar298 = auVar119._20_4_ * fVar298;
      auVar55._20_4_ = fVar298;
      fVar301 = auVar119._24_4_ * fVar301;
      auVar55._24_4_ = fVar301;
      auVar55._28_4_ = auVar119._28_4_;
      local_5e0._4_4_ = fVar287 * (fVar242 + fVar407 * fVar132);
      local_5e0._0_4_ = fVar225 * (fVar226 + fVar402 * fVar272);
      fStack_5d8 = fVar294 * (fVar244 + fVar408 * fVar314);
      fStack_5d4 = fVar315 * (fVar246 + fVar409 * fVar316);
      fStack_5d0 = fVar335 * (fVar247 + fVar410 * fVar318);
      fStack_5cc = fVar269 * (fVar248 + fVar412 * fVar320);
      fStack_5c8 = fVar271 * (fVar249 + fVar414 * fVar322);
      uStack_5c4 = 0x40800000;
      auVar362._8_4_ = 0x7fffffff;
      auVar362._0_8_ = 0x7fffffff7fffffff;
      auVar362._12_4_ = 0x7fffffff;
      auVar362._16_4_ = 0x7fffffff;
      auVar362._20_4_ = 0x7fffffff;
      auVar362._24_4_ = 0x7fffffff;
      auVar362._28_4_ = 0x7fffffff;
      auVar119 = vandps_avx(auVar50,auVar362);
      auVar119 = vmaxps_avx(local_460,auVar119);
      auVar56._4_4_ = auVar119._4_4_ * 1.9073486e-06;
      auVar56._0_4_ = auVar119._0_4_ * 1.9073486e-06;
      auVar56._8_4_ = auVar119._8_4_ * 1.9073486e-06;
      auVar56._12_4_ = auVar119._12_4_ * 1.9073486e-06;
      auVar56._16_4_ = auVar119._16_4_ * 1.9073486e-06;
      auVar56._20_4_ = auVar119._20_4_ * 1.9073486e-06;
      auVar56._24_4_ = auVar119._24_4_ * 1.9073486e-06;
      auVar56._28_4_ = auVar119._28_4_;
      auVar119 = vandps_avx(local_480,auVar362);
      auVar119 = vcmpps_avx(auVar119,auVar56,1);
      auVar330._8_4_ = 0x7f800000;
      auVar330._0_8_ = 0x7f8000007f800000;
      auVar330._12_4_ = 0x7f800000;
      auVar330._16_4_ = 0x7f800000;
      auVar330._20_4_ = 0x7f800000;
      auVar330._24_4_ = 0x7f800000;
      auVar330._28_4_ = 0x7f800000;
      auVar392 = vblendvps_avx(auVar330,auVar54,auVar37);
      local_600 = fVar225 * (fVar226 + fVar402 * fVar273);
      fStack_5fc = fVar287 * (fVar242 + fVar407 * fVar286);
      fStack_5f8 = fVar294 * (fVar244 + fVar408 * fVar289);
      fStack_5f4 = fVar315 * (fVar246 + fVar409 * fVar292);
      fStack_5f0 = fVar335 * (fVar247 + fVar410 * fVar295);
      fStack_5ec = fVar269 * (fVar248 + fVar412 * fVar298);
      fStack_5e8 = fVar271 * (fVar249 + fVar414 * fVar301);
      uStack_5e4 = 0x40800000;
      auVar280._8_4_ = 0xff800000;
      auVar280._0_8_ = 0xff800000ff800000;
      auVar280._12_4_ = 0xff800000;
      auVar280._16_4_ = 0xff800000;
      auVar280._20_4_ = 0xff800000;
      auVar280._24_4_ = 0xff800000;
      auVar280._28_4_ = 0xff800000;
      auVar370 = vblendvps_avx(auVar280,auVar55,auVar37);
      auVar240 = auVar37 & auVar119;
      if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar240 >> 0x7f,0) != '\0') ||
            (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar240 >> 0xbf,0) != '\0') ||
          (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar240[0x1f] < '\0') {
        auVar118 = vandps_avx(auVar119,auVar37);
        auVar208 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
        auVar240 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar280 = vcmpps_avx(auVar32,auVar240,2);
        auVar365._8_4_ = 0xff800000;
        auVar365._0_8_ = 0xff800000ff800000;
        auVar365._12_4_ = 0xff800000;
        auVar365._16_4_ = 0xff800000;
        auVar365._20_4_ = 0xff800000;
        auVar365._24_4_ = 0xff800000;
        auVar365._28_4_ = 0xff800000;
        auVar382._8_4_ = 0x7f800000;
        auVar382._0_8_ = 0x7f8000007f800000;
        auVar382._12_4_ = 0x7f800000;
        auVar382._16_4_ = 0x7f800000;
        auVar382._20_4_ = 0x7f800000;
        auVar382._24_4_ = 0x7f800000;
        auVar382._28_4_ = 0x7f800000;
        auVar383 = ZEXT3264(auVar382);
        auVar119 = vblendvps_avx(auVar382,auVar365,auVar280);
        auVar214 = vpmovsxwd_avx(auVar208);
        auVar208 = vpunpckhwd_avx(auVar208,auVar208);
        auVar262._16_16_ = auVar208;
        auVar262._0_16_ = auVar214;
        auVar392 = vblendvps_avx(auVar392,auVar119,auVar262);
        auVar310._8_4_ = 0xff800000;
        auVar310._0_8_ = 0xff800000ff800000;
        auVar310._12_4_ = 0xff800000;
        auVar310._16_4_ = 0xff800000;
        auVar310._20_4_ = 0xff800000;
        auVar310._24_4_ = 0xff800000;
        auVar310._28_4_ = 0xff800000;
        auVar119 = vblendvps_avx(auVar310,auVar382,auVar280);
        auVar370 = vblendvps_avx(auVar370,auVar119,auVar262);
        auVar119 = vcmpps_avx(auVar240,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
        auVar130._0_4_ = auVar118._0_4_ ^ auVar119._0_4_;
        auVar130._4_4_ = auVar118._4_4_ ^ auVar119._4_4_;
        auVar130._8_4_ = auVar118._8_4_ ^ auVar119._8_4_;
        auVar130._12_4_ = auVar118._12_4_ ^ auVar119._12_4_;
        auVar130._16_4_ = auVar118._16_4_ ^ auVar119._16_4_;
        auVar130._20_4_ = auVar118._20_4_ ^ auVar119._20_4_;
        auVar130._24_4_ = auVar118._24_4_ ^ auVar119._24_4_;
        auVar130._28_4_ = auVar118._28_4_ ^ auVar119._28_4_;
        auVar118 = vorps_avx(auVar280,auVar130);
        auVar118 = vandps_avx(auVar37,auVar118);
      }
    }
    auVar371 = ZEXT3264(auVar370);
    auVar285 = ZEXT3264(auVar280);
    auVar367 = ZEXT3264(CONCAT428(fStack_744,
                                  CONCAT424(fStack_748,
                                            CONCAT420(fStack_74c,
                                                      CONCAT416(fStack_750,
                                                                CONCAT412(fStack_754,
                                                                          CONCAT48(fStack_758,
                                                                                   CONCAT44(
                                                  fStack_75c,local_760))))))));
    auVar119 = local_2e0 & auVar118;
    auVar311 = ZEXT3264(local_a60);
    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar119 >> 0x7f,0) != '\0') ||
          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar119 >> 0xbf,0) != '\0') ||
        (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar119[0x1f] < '\0') {
      auVar208 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_800._0_4_));
      auVar208 = vshufps_avx(auVar208,auVar208,0);
      auVar256._16_16_ = auVar208;
      auVar256._0_16_ = auVar208;
      auVar37 = vmaxps_avx(auVar256,auVar392);
      auVar208 = ZEXT416((uint)(ray->tfar - (float)local_800._0_4_));
      auVar208 = vshufps_avx(auVar208,auVar208,0);
      auVar257._16_16_ = auVar208;
      auVar257._0_16_ = auVar208;
      auVar240 = vminps_avx(auVar257,auVar370);
      fVar298 = auVar36._28_4_;
      auVar187._0_4_ = local_560 * fVar379 + local_760 * fVar368 + fVar339 * local_780;
      auVar187._4_4_ = fStack_55c * fVar384 + fStack_75c * fVar372 + fVar346 * fStack_77c;
      auVar187._8_4_ = fStack_558 * fVar385 + fStack_758 * fVar373 + fVar348 * fStack_778;
      auVar187._12_4_ = fStack_554 * fVar386 + fStack_754 * fVar374 + fVar350 * fStack_774;
      auVar187._16_4_ = fStack_550 * fVar387 + fStack_750 * fVar375 + fVar352 * fStack_770;
      auVar187._20_4_ = fStack_54c * fVar388 + fStack_74c * fVar376 + fVar354 * fStack_76c;
      auVar187._24_4_ = fStack_548 * fVar389 + fStack_748 * fVar377 + fVar356 * fStack_768;
      auVar187._28_4_ = fVar298 + fVar298 + auVar35._28_4_;
      auVar119 = vrcpps_avx(auVar187);
      fVar272 = auVar119._0_4_;
      fVar132 = auVar119._4_4_;
      auVar57._4_4_ = auVar187._4_4_ * fVar132;
      auVar57._0_4_ = auVar187._0_4_ * fVar272;
      fVar273 = auVar119._8_4_;
      auVar57._8_4_ = auVar187._8_4_ * fVar273;
      fVar286 = auVar119._12_4_;
      auVar57._12_4_ = auVar187._12_4_ * fVar286;
      fVar289 = auVar119._16_4_;
      auVar57._16_4_ = auVar187._16_4_ * fVar289;
      fVar292 = auVar119._20_4_;
      auVar57._20_4_ = auVar187._20_4_ * fVar292;
      fVar295 = auVar119._24_4_;
      auVar57._24_4_ = auVar187._24_4_ * fVar295;
      auVar57._28_4_ = uStack_1c4;
      auVar393._8_4_ = 0x3f800000;
      auVar393._0_8_ = 0x3f8000003f800000;
      auVar393._12_4_ = 0x3f800000;
      auVar393._16_4_ = 0x3f800000;
      auVar393._20_4_ = 0x3f800000;
      auVar393._24_4_ = 0x3f800000;
      auVar393._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar393,auVar57);
      auVar344._8_4_ = 0x7fffffff;
      auVar344._0_8_ = 0x7fffffff7fffffff;
      auVar344._12_4_ = 0x7fffffff;
      auVar344._16_4_ = 0x7fffffff;
      auVar344._20_4_ = 0x7fffffff;
      auVar344._24_4_ = 0x7fffffff;
      auVar344._28_4_ = 0x7fffffff;
      auVar119 = vandps_avx(auVar344,auVar187);
      auVar403._8_4_ = 0x219392ef;
      auVar403._0_8_ = 0x219392ef219392ef;
      auVar403._12_4_ = 0x219392ef;
      auVar403._16_4_ = 0x219392ef;
      auVar403._20_4_ = 0x219392ef;
      auVar403._24_4_ = 0x219392ef;
      auVar403._28_4_ = 0x219392ef;
      auVar119 = vcmpps_avx(auVar119,auVar403,1);
      auVar58._4_4_ =
           (fVar132 + fVar132 * auVar32._4_4_) *
           -(fVar384 * fVar266 + fVar372 * fVar265 + fVar346 * fVar264);
      auVar58._0_4_ =
           (fVar272 + fVar272 * auVar32._0_4_) *
           -(fVar379 * fVar224 + fVar368 * fVar223 + fVar339 * fVar222);
      auVar58._8_4_ =
           (fVar273 + fVar273 * auVar32._8_4_) *
           -(fVar385 * fVar293 + fVar373 * fVar291 + fVar348 * fVar290);
      auVar58._12_4_ =
           (fVar286 + fVar286 * auVar32._12_4_) *
           -(fVar386 * fVar313 + fVar374 * fVar312 + fVar350 * fVar302);
      auVar58._16_4_ =
           (fVar289 + fVar289 * auVar32._16_4_) *
           -(fVar387 * fVar334 + fVar375 * fVar333 + fVar352 * fVar332);
      auVar58._20_4_ =
           (fVar292 + fVar292 * auVar32._20_4_) *
           -(fVar388 * fVar19 + fVar376 * fVar378 + fVar354 * fVar359);
      auVar58._24_4_ =
           (fVar295 + fVar295 * auVar32._24_4_) *
           -(fVar389 * fVar26 + fVar377 * fVar25 + fVar356 * fVar24);
      auVar58._28_4_ = -(auVar35._28_4_ + local_320._28_4_ + fVar298);
      auVar32 = vcmpps_avx(auVar187,ZEXT832(0) << 0x20,1);
      auVar35 = vorps_avx(auVar119,auVar32);
      auVar32 = vcmpps_avx(auVar187,ZEXT832(0) << 0x20,6);
      auVar32 = vorps_avx(auVar119,auVar32);
      auVar363._8_4_ = 0xff800000;
      auVar363._0_8_ = 0xff800000ff800000;
      auVar363._12_4_ = 0xff800000;
      auVar363._16_4_ = 0xff800000;
      auVar363._20_4_ = 0xff800000;
      auVar363._24_4_ = 0xff800000;
      auVar363._28_4_ = 0xff800000;
      auVar119 = vblendvps_avx(auVar58,auVar363,auVar35);
      auVar404._8_4_ = 0x7f800000;
      auVar404._0_8_ = 0x7f8000007f800000;
      auVar404._12_4_ = 0x7f800000;
      auVar404._16_4_ = 0x7f800000;
      auVar404._20_4_ = 0x7f800000;
      auVar404._24_4_ = 0x7f800000;
      auVar404._28_4_ = 0x7f800000;
      auVar32 = vblendvps_avx(auVar58,auVar404,auVar32);
      auVar35 = vmaxps_avx(auVar37,auVar119);
      auVar383 = ZEXT3264(CONCAT428(fStack_764,
                                    CONCAT424(fStack_768,
                                              CONCAT420(fStack_76c,
                                                        CONCAT416(fStack_770,
                                                                  CONCAT412(fStack_774,
                                                                            CONCAT48(fStack_778,
                                                                                     CONCAT44(
                                                  fStack_77c,local_780))))))));
      auVar37 = vminps_avx(auVar240,auVar32);
      auVar371 = ZEXT3264(auVar37);
      auVar309 = ZEXT832(0) << 0x20;
      auVar119 = vsubps_avx(auVar309,auVar30);
      auVar32 = vsubps_avx(auVar309,auVar218);
      auVar59._4_4_ = auVar32._4_4_ * -fVar251;
      auVar59._0_4_ = auVar32._0_4_ * -fVar201;
      auVar59._8_4_ = auVar32._8_4_ * -fVar270;
      auVar59._12_4_ = auVar32._12_4_ * -fVar300;
      auVar59._16_4_ = auVar32._16_4_ * -fVar323;
      auVar59._20_4_ = auVar32._20_4_ * -fVar358;
      auVar59._24_4_ = auVar32._24_4_ * -fVar23;
      auVar59._28_4_ = auVar32._28_4_;
      auVar60._4_4_ = fVar395 * auVar119._4_4_;
      auVar60._0_4_ = fVar390 * auVar119._0_4_;
      auVar60._8_4_ = fVar396 * auVar119._8_4_;
      auVar60._12_4_ = fVar397 * auVar119._12_4_;
      auVar60._16_4_ = fVar398 * auVar119._16_4_;
      auVar60._20_4_ = fVar399 * auVar119._20_4_;
      auVar60._24_4_ = fVar400 * auVar119._24_4_;
      auVar60._28_4_ = auVar119._28_4_;
      auVar119 = vsubps_avx(auVar59,auVar60);
      auVar32 = vsubps_avx(auVar309,local_6c0);
      auVar345 = ZEXT3264(auVar118);
      auVar61._4_4_ = fVar347 * auVar32._4_4_;
      auVar61._0_4_ = fVar340 * auVar32._0_4_;
      auVar61._8_4_ = fVar349 * auVar32._8_4_;
      auVar61._12_4_ = fVar351 * auVar32._12_4_;
      auVar61._16_4_ = fVar353 * auVar32._16_4_;
      auVar61._20_4_ = fVar355 * auVar32._20_4_;
      uVar7 = auVar32._28_4_;
      auVar61._24_4_ = fVar357 * auVar32._24_4_;
      auVar61._28_4_ = uVar7;
      auVar240 = vsubps_avx(auVar119,auVar61);
      auVar62._4_4_ = fStack_77c * -fVar251;
      auVar62._0_4_ = local_780 * -fVar201;
      auVar62._8_4_ = fStack_778 * -fVar270;
      auVar62._12_4_ = fStack_774 * -fVar300;
      auVar62._16_4_ = fStack_770 * -fVar323;
      auVar62._20_4_ = fStack_76c * -fVar358;
      auVar62._24_4_ = fStack_768 * -fVar23;
      auVar62._28_4_ = local_700._28_4_ ^ 0x80000000;
      auVar63._4_4_ = fStack_75c * fVar395;
      auVar63._0_4_ = local_760 * fVar390;
      auVar63._8_4_ = fStack_758 * fVar396;
      auVar63._12_4_ = fStack_754 * fVar397;
      auVar63._16_4_ = fStack_750 * fVar398;
      auVar63._20_4_ = fStack_74c * fVar399;
      auVar63._24_4_ = fStack_748 * fVar400;
      auVar63._28_4_ = uVar7;
      auVar119 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fStack_55c * fVar347;
      auVar64._0_4_ = local_560 * fVar340;
      auVar64._8_4_ = fStack_558 * fVar349;
      auVar64._12_4_ = fStack_554 * fVar351;
      auVar64._16_4_ = fStack_550 * fVar353;
      auVar64._20_4_ = fStack_54c * fVar355;
      auVar64._24_4_ = fStack_548 * fVar357;
      auVar64._28_4_ = uVar7;
      auVar38 = vsubps_avx(auVar119,auVar64);
      auVar119 = vrcpps_avx(auVar38);
      fVar201 = auVar119._0_4_;
      fVar222 = auVar119._4_4_;
      auVar65._4_4_ = auVar38._4_4_ * fVar222;
      auVar65._0_4_ = auVar38._0_4_ * fVar201;
      fVar223 = auVar119._8_4_;
      auVar65._8_4_ = auVar38._8_4_ * fVar223;
      fVar224 = auVar119._12_4_;
      auVar65._12_4_ = auVar38._12_4_ * fVar224;
      fVar251 = auVar119._16_4_;
      auVar65._16_4_ = auVar38._16_4_ * fVar251;
      fVar264 = auVar119._20_4_;
      auVar65._20_4_ = auVar38._20_4_ * fVar264;
      fVar265 = auVar119._24_4_;
      auVar65._24_4_ = auVar38._24_4_ * fVar265;
      auVar65._28_4_ = fStack_544;
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar122._16_4_ = 0x3f800000;
      auVar122._20_4_ = 0x3f800000;
      auVar122._24_4_ = 0x3f800000;
      auVar122._28_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar122,auVar65);
      auVar123._8_4_ = 0x7fffffff;
      auVar123._0_8_ = 0x7fffffff7fffffff;
      auVar123._12_4_ = 0x7fffffff;
      auVar123._16_4_ = 0x7fffffff;
      auVar123._20_4_ = 0x7fffffff;
      auVar123._24_4_ = 0x7fffffff;
      auVar123._28_4_ = 0x7fffffff;
      auVar119 = vandps_avx(auVar38,auVar123);
      auVar124._8_4_ = 0x219392ef;
      auVar124._0_8_ = 0x219392ef219392ef;
      auVar124._12_4_ = 0x219392ef;
      auVar124._16_4_ = 0x219392ef;
      auVar124._20_4_ = 0x219392ef;
      auVar124._24_4_ = 0x219392ef;
      auVar124._28_4_ = 0x219392ef;
      auVar32 = vcmpps_avx(auVar119,auVar124,1);
      auVar285 = ZEXT3264(auVar32);
      auVar66._4_4_ = (fVar222 + fVar222 * auVar39._4_4_) * -auVar240._4_4_;
      auVar66._0_4_ = (fVar201 + fVar201 * auVar39._0_4_) * -auVar240._0_4_;
      auVar66._8_4_ = (fVar223 + fVar223 * auVar39._8_4_) * -auVar240._8_4_;
      auVar66._12_4_ = (fVar224 + fVar224 * auVar39._12_4_) * -auVar240._12_4_;
      auVar66._16_4_ = (fVar251 + fVar251 * auVar39._16_4_) * -auVar240._16_4_;
      auVar66._20_4_ = (fVar264 + fVar264 * auVar39._20_4_) * -auVar240._20_4_;
      auVar66._24_4_ = (fVar265 + fVar265 * auVar39._24_4_) * -auVar240._24_4_;
      auVar66._28_4_ = auVar240._28_4_ ^ 0x80000000;
      auVar119 = vcmpps_avx(auVar38,auVar309,1);
      auVar119 = vorps_avx(auVar32,auVar119);
      auVar119 = vblendvps_avx(auVar66,auVar363,auVar119);
      _local_900 = vmaxps_avx(auVar35,auVar119);
      auVar119 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,6);
      auVar119 = vorps_avx(auVar32,auVar119);
      auVar119 = vblendvps_avx(auVar66,auVar404,auVar119);
      auVar118 = vandps_avx(auVar118,local_2e0);
      local_4e0 = vminps_avx(auVar37,auVar119);
      auVar119 = vcmpps_avx(_local_900,local_4e0,2);
      auVar32 = auVar118 & auVar119;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0x7f,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar32 >> 0xbf,0) != '\0') ||
          (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar32[0x1f] < '\0') {
        auVar32 = vminps_avx(_local_aa0,auVar121);
        auVar188 = vminps_avx(auVar188,auVar34);
        auVar188 = vminps_avx(auVar32,auVar188);
        auVar31 = vsubps_avx(auVar188,auVar31);
        auVar118 = vandps_avx(auVar119,auVar118);
        auVar405._8_4_ = 0x3f800000;
        auVar405._0_8_ = 0x3f8000003f800000;
        auVar405._12_4_ = 0x3f800000;
        auVar405._16_4_ = 0x3f800000;
        auVar405._20_4_ = 0x3f800000;
        auVar405._24_4_ = 0x3f800000;
        auVar405._28_4_ = 0x3f800000;
        auVar119 = vminps_avx(_local_5e0,auVar405);
        auVar119 = vmaxps_avx(auVar119,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar175 + fVar137 * (auVar119._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar198 + fVar159 * (auVar119._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar199 + fVar163 * (auVar119._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar200 + fVar168 * (auVar119._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar175 + fVar137 * (auVar119._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar198 + fVar159 * (auVar119._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar199 + fVar163 * (auVar119._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar200 + auVar119._28_4_ + 7.0;
        auVar87._4_4_ = fStack_5fc;
        auVar87._0_4_ = local_600;
        auVar87._8_4_ = fStack_5f8;
        auVar87._12_4_ = fStack_5f4;
        auVar87._16_4_ = fStack_5f0;
        auVar87._20_4_ = fStack_5ec;
        auVar87._24_4_ = fStack_5e8;
        auVar87._28_4_ = uStack_5e4;
        auVar119 = vminps_avx(auVar87,auVar405);
        auVar119 = vmaxps_avx(auVar119,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar175 + fVar137 * (auVar119._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar198 + fVar159 * (auVar119._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar199 + fVar163 * (auVar119._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar200 + fVar168 * (auVar119._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar175 + fVar137 * (auVar119._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar198 + fVar159 * (auVar119._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar199 + fVar163 * (auVar119._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar200 + auVar119._28_4_ + 7.0;
        auVar67._4_4_ = auVar31._4_4_ * 0.99999976;
        auVar67._0_4_ = auVar31._0_4_ * 0.99999976;
        auVar67._8_4_ = auVar31._8_4_ * 0.99999976;
        auVar67._12_4_ = auVar31._12_4_ * 0.99999976;
        auVar67._16_4_ = auVar31._16_4_ * 0.99999976;
        auVar67._20_4_ = auVar31._20_4_ * 0.99999976;
        auVar67._24_4_ = auVar31._24_4_ * 0.99999976;
        auVar67._28_4_ = 0x3f7ffffc;
        auVar119 = vmaxps_avx(ZEXT832(0) << 0x20,auVar67);
        auVar68._4_4_ = auVar119._4_4_ * auVar119._4_4_;
        auVar68._0_4_ = auVar119._0_4_ * auVar119._0_4_;
        auVar68._8_4_ = auVar119._8_4_ * auVar119._8_4_;
        auVar68._12_4_ = auVar119._12_4_ * auVar119._12_4_;
        auVar68._16_4_ = auVar119._16_4_ * auVar119._16_4_;
        auVar68._20_4_ = auVar119._20_4_ * auVar119._20_4_;
        auVar68._24_4_ = auVar119._24_4_ * auVar119._24_4_;
        auVar68._28_4_ = auVar119._28_4_;
        local_9c0 = vsubps_avx(auVar36,auVar68);
        auVar69._4_4_ = local_9c0._4_4_ * fVar134 * 4.0;
        auVar69._0_4_ = local_9c0._0_4_ * fVar133 * 4.0;
        auVar69._8_4_ = local_9c0._8_4_ * fVar135 * 4.0;
        auVar69._12_4_ = local_9c0._12_4_ * fVar136 * 4.0;
        auVar69._16_4_ = local_9c0._16_4_ * fVar411 * 4.0;
        auVar69._20_4_ = local_9c0._20_4_ * fVar413 * 4.0;
        auVar69._24_4_ = local_9c0._24_4_ * fVar415 * 4.0;
        auVar69._28_4_ = auVar119._28_4_;
        auVar31 = vsubps_avx(auVar51,auVar69);
        local_820 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,5);
        auVar119 = local_820;
        if ((((((((local_820 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_820 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_820 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_820 >> 0x7f,0) == '\0') &&
              (local_820 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_820 >> 0xbf,0) == '\0') &&
            (local_820 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_820[0x1f]) {
          _local_640 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_7c0 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar188 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar371 = ZEXT864(0) << 0x20;
          auVar217 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar258._8_4_ = 0x7f800000;
          auVar258._0_8_ = 0x7f8000007f800000;
          auVar258._12_4_ = 0x7f800000;
          auVar258._16_4_ = 0x7f800000;
          auVar258._20_4_ = 0x7f800000;
          auVar258._24_4_ = 0x7f800000;
          auVar258._28_4_ = 0x7f800000;
          auVar281._8_4_ = 0xff800000;
          auVar281._0_8_ = 0xff800000ff800000;
          auVar281._12_4_ = 0xff800000;
          auVar281._16_4_ = 0xff800000;
          auVar281._20_4_ = 0xff800000;
          auVar281._24_4_ = 0xff800000;
          auVar281._28_4_ = 0xff800000;
          local_9c0 = auVar218;
          local_820 = auVar30;
          _local_620 = _local_640;
        }
        else {
          auVar218 = vsqrtps_avx(auVar31);
          auVar189._0_4_ = fVar133 + fVar133;
          auVar189._4_4_ = fVar134 + fVar134;
          auVar189._8_4_ = fVar135 + fVar135;
          auVar189._12_4_ = fVar136 + fVar136;
          auVar189._16_4_ = fVar411 + fVar411;
          auVar189._20_4_ = fVar413 + fVar413;
          auVar189._24_4_ = fVar415 + fVar415;
          auVar189._28_4_ = fVar101 + fVar101;
          auVar30 = vrcpps_avx(auVar189);
          fVar101 = auVar30._0_4_;
          fVar201 = auVar30._4_4_;
          auVar70._4_4_ = auVar189._4_4_ * fVar201;
          auVar70._0_4_ = auVar189._0_4_ * fVar101;
          fVar222 = auVar30._8_4_;
          auVar70._8_4_ = auVar189._8_4_ * fVar222;
          fVar223 = auVar30._12_4_;
          auVar70._12_4_ = auVar189._12_4_ * fVar223;
          fVar224 = auVar30._16_4_;
          auVar70._16_4_ = auVar189._16_4_ * fVar224;
          fVar251 = auVar30._20_4_;
          auVar70._20_4_ = auVar189._20_4_ * fVar251;
          fVar264 = auVar30._24_4_;
          auVar70._24_4_ = auVar189._24_4_ * fVar264;
          auVar70._28_4_ = auVar189._28_4_;
          auVar188 = vsubps_avx(auVar405,auVar70);
          fVar101 = fVar101 + fVar101 * auVar188._0_4_;
          fVar201 = fVar201 + fVar201 * auVar188._4_4_;
          fVar222 = fVar222 + fVar222 * auVar188._8_4_;
          fVar223 = fVar223 + fVar223 * auVar188._12_4_;
          fVar224 = fVar224 + fVar224 * auVar188._16_4_;
          fVar251 = fVar251 + fVar251 * auVar188._20_4_;
          fVar264 = fVar264 + fVar264 * auVar188._24_4_;
          fVar265 = auVar30._28_4_ + auVar188._28_4_;
          auVar219._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
          auVar219._8_4_ = -local_320._8_4_;
          auVar219._12_4_ = -local_320._12_4_;
          auVar219._16_4_ = -local_320._16_4_;
          auVar219._20_4_ = -local_320._20_4_;
          auVar219._24_4_ = -local_320._24_4_;
          auVar219._28_4_ = -local_320._28_4_;
          auVar30 = vsubps_avx(auVar219,auVar218);
          fVar312 = auVar30._0_4_ * fVar101;
          fVar313 = auVar30._4_4_ * fVar201;
          auVar71._4_4_ = fVar313;
          auVar71._0_4_ = fVar312;
          fVar323 = auVar30._8_4_ * fVar222;
          auVar71._8_4_ = fVar323;
          fVar332 = auVar30._12_4_ * fVar223;
          auVar71._12_4_ = fVar332;
          fVar333 = auVar30._16_4_ * fVar224;
          auVar71._16_4_ = fVar333;
          fVar334 = auVar30._20_4_ * fVar251;
          auVar71._20_4_ = fVar334;
          fVar358 = auVar30._24_4_ * fVar264;
          auVar71._24_4_ = fVar358;
          auVar71._28_4_ = auVar118._28_4_;
          auVar218 = vsubps_avx(auVar218,local_320);
          fVar101 = auVar218._0_4_ * fVar101;
          fVar201 = auVar218._4_4_ * fVar201;
          auVar72._4_4_ = fVar201;
          auVar72._0_4_ = fVar101;
          fVar222 = auVar218._8_4_ * fVar222;
          auVar72._8_4_ = fVar222;
          fVar223 = auVar218._12_4_ * fVar223;
          auVar72._12_4_ = fVar223;
          fVar224 = auVar218._16_4_ * fVar224;
          auVar72._16_4_ = fVar224;
          fVar251 = auVar218._20_4_ * fVar251;
          auVar72._20_4_ = fVar251;
          fVar264 = auVar218._24_4_ * fVar264;
          auVar72._24_4_ = fVar264;
          auVar72._28_4_ = fStack_764;
          auVar383 = ZEXT3264(auVar72);
          fVar266 = fVar225 * (fVar312 * fVar402 + fVar226);
          fVar270 = fVar287 * (fVar313 * fVar407 + fVar242);
          fVar290 = fVar294 * (fVar323 * fVar408 + fVar244);
          fVar291 = fVar315 * (fVar332 * fVar409 + fVar246);
          fVar293 = fVar335 * (fVar333 * fVar410 + fVar247);
          fVar300 = fVar269 * (fVar334 * fVar412 + fVar248);
          fVar302 = fVar271 * (fVar358 * fVar414 + fVar249);
          local_680._28_4_ = auVar33._28_4_;
          auVar152._0_4_ = local_860 + fVar166 * fVar266;
          auVar152._4_4_ = fStack_85c + fVar245 * fVar270;
          auVar152._8_4_ = fStack_858 + fVar268 * fVar290;
          auVar152._12_4_ = fStack_854 + fVar299 * fVar291;
          auVar152._16_4_ = fStack_850 + fVar321 * fVar293;
          auVar152._20_4_ = fStack_84c + fVar338 * fVar300;
          auVar152._24_4_ = fStack_848 + fVar22 * fVar302;
          auVar152._28_4_ = fStack_844 + auVar218._28_4_ + fVar250;
          auVar73._4_4_ = fStack_55c * fVar313;
          auVar73._0_4_ = local_560 * fVar312;
          auVar73._8_4_ = fStack_558 * fVar323;
          auVar73._12_4_ = fStack_554 * fVar332;
          auVar73._16_4_ = fStack_550 * fVar333;
          auVar73._20_4_ = fStack_54c * fVar334;
          auVar73._24_4_ = fStack_548 * fVar358;
          auVar73._28_4_ = fVar265;
          auVar188 = vsubps_avx(auVar73,auVar152);
          auVar190._0_4_ = fVar138 + fVar140 * fVar266;
          auVar190._4_4_ = fVar160 + fVar241 * fVar270;
          auVar190._8_4_ = fVar164 + fVar288 * fVar290;
          auVar190._12_4_ = fVar169 + fVar296 * fVar291;
          auVar190._16_4_ = fVar171 + fVar317 * fVar293;
          auVar190._20_4_ = fVar172 + fVar336 * fVar300;
          auVar190._24_4_ = fVar173 + fVar20 * fVar302;
          auVar190._28_4_ = fVar174 + fVar265;
          auVar259._0_4_ = local_760 * fVar312;
          auVar259._4_4_ = fStack_75c * fVar313;
          auVar259._8_4_ = fStack_758 * fVar323;
          auVar259._12_4_ = fStack_754 * fVar332;
          auVar259._16_4_ = fStack_750 * fVar333;
          auVar259._20_4_ = fStack_74c * fVar334;
          auVar259._24_4_ = fStack_748 * fVar358;
          auVar259._28_4_ = 0;
          auVar218 = vsubps_avx(auVar259,auVar190);
          auVar220._0_4_ = fVar139 + fVar162 * fVar266;
          auVar220._4_4_ = fVar161 + fVar243 * fVar270;
          auVar220._8_4_ = fVar165 + fVar267 * fVar290;
          auVar220._12_4_ = fVar170 + fVar297 * fVar291;
          auVar220._16_4_ = fStack_830 + fVar319 * fVar293;
          auVar220._20_4_ = fStack_82c + fVar337 * fVar300;
          auVar220._24_4_ = fStack_828 + fVar21 * fVar302;
          auVar220._28_4_ = fStack_824 + auVar30._28_4_;
          auVar74._4_4_ = fVar313 * fStack_77c;
          auVar74._0_4_ = fVar312 * local_780;
          auVar74._8_4_ = fVar323 * fStack_778;
          auVar74._12_4_ = fVar332 * fStack_774;
          auVar74._16_4_ = fVar333 * fStack_770;
          auVar74._20_4_ = fVar334 * fStack_76c;
          auVar74._24_4_ = fVar358 * fStack_768;
          auVar74._28_4_ = 0;
          auVar30 = vsubps_avx(auVar74,auVar220);
          auVar217 = auVar30._0_28_;
          fVar225 = fVar225 * (fVar101 * fVar402 + fVar226);
          fVar287 = fVar287 * (fVar201 * fVar407 + fVar242);
          fVar294 = fVar294 * (fVar222 * fVar408 + fVar244);
          fVar315 = fVar315 * (fVar223 * fVar409 + fVar246);
          fVar335 = fVar335 * (fVar224 * fVar410 + fVar247);
          fVar269 = fVar269 * (fVar251 * fVar412 + fVar248);
          fVar271 = fVar271 * (fVar264 * fVar414 + fVar249);
          auVar282._0_4_ = local_860 + fVar166 * fVar225;
          auVar282._4_4_ = fStack_85c + fVar245 * fVar287;
          auVar282._8_4_ = fStack_858 + fVar268 * fVar294;
          auVar282._12_4_ = fStack_854 + fVar299 * fVar315;
          auVar282._16_4_ = fStack_850 + fVar321 * fVar335;
          auVar282._20_4_ = fStack_84c + fVar338 * fVar269;
          auVar282._24_4_ = fStack_848 + fVar22 * fVar271;
          auVar282._28_4_ = fStack_844 + (float)local_680._28_4_;
          auVar75._4_4_ = fStack_55c * fVar201;
          auVar75._0_4_ = local_560 * fVar101;
          auVar75._8_4_ = fStack_558 * fVar222;
          auVar75._12_4_ = fStack_554 * fVar223;
          auVar75._16_4_ = fStack_550 * fVar224;
          auVar75._20_4_ = fStack_54c * fVar251;
          auVar75._24_4_ = fStack_548 * fVar264;
          auVar75._28_4_ = fStack_844;
          _local_620 = vsubps_avx(auVar75,auVar282);
          auVar283._0_4_ = fVar138 + fVar140 * fVar225;
          auVar283._4_4_ = fVar160 + fVar241 * fVar287;
          auVar283._8_4_ = fVar164 + fVar288 * fVar294;
          auVar283._12_4_ = fVar169 + fVar296 * fVar315;
          auVar283._16_4_ = fVar171 + fVar317 * fVar335;
          auVar283._20_4_ = fVar172 + fVar336 * fVar269;
          auVar283._24_4_ = fVar173 + fVar20 * fVar271;
          auVar283._28_4_ = fVar174 + local_620._28_4_;
          auVar76._4_4_ = fStack_75c * fVar201;
          auVar76._0_4_ = local_760 * fVar101;
          auVar76._8_4_ = fStack_758 * fVar222;
          auVar76._12_4_ = fStack_754 * fVar223;
          auVar76._16_4_ = fStack_750 * fVar224;
          auVar76._20_4_ = fStack_74c * fVar251;
          auVar76._24_4_ = fStack_748 * fVar264;
          auVar76._28_4_ = fStack_844;
          _local_640 = vsubps_avx(auVar76,auVar283);
          auVar260._0_4_ = fVar139 + fVar162 * fVar225;
          auVar260._4_4_ = fVar161 + fVar243 * fVar287;
          auVar260._8_4_ = fVar165 + fVar267 * fVar294;
          auVar260._12_4_ = fVar170 + fVar297 * fVar315;
          auVar260._16_4_ = fStack_830 + fVar319 * fVar335;
          auVar260._20_4_ = fStack_82c + fVar337 * fVar269;
          auVar260._24_4_ = fStack_828 + fVar21 * fVar271;
          auVar260._28_4_ = fStack_824 + fVar250 + 0.0;
          auVar77._4_4_ = fVar201 * fStack_77c;
          auVar77._0_4_ = fVar101 * local_780;
          auVar77._8_4_ = fVar222 * fStack_778;
          auVar77._12_4_ = fVar223 * fStack_774;
          auVar77._16_4_ = fVar224 * fStack_770;
          auVar77._20_4_ = fVar251 * fStack_76c;
          auVar77._24_4_ = fVar264 * fStack_768;
          auVar77._28_4_ = local_640._28_4_;
          _local_7c0 = vsubps_avx(auVar77,auVar260);
          auVar30 = vcmpps_avx(auVar31,_DAT_01faff00,5);
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar258 = vblendvps_avx(auVar261,auVar71,auVar30);
          auVar364._8_4_ = 0x7fffffff;
          auVar364._0_8_ = 0x7fffffff7fffffff;
          auVar364._12_4_ = 0x7fffffff;
          auVar364._16_4_ = 0x7fffffff;
          auVar364._20_4_ = 0x7fffffff;
          auVar364._24_4_ = 0x7fffffff;
          auVar364._28_4_ = 0x7fffffff;
          auVar31 = vandps_avx(auVar364,auVar50);
          auVar31 = vmaxps_avx(local_460,auVar31);
          auVar78._4_4_ = auVar31._4_4_ * 1.9073486e-06;
          auVar78._0_4_ = auVar31._0_4_ * 1.9073486e-06;
          auVar78._8_4_ = auVar31._8_4_ * 1.9073486e-06;
          auVar78._12_4_ = auVar31._12_4_ * 1.9073486e-06;
          auVar78._16_4_ = auVar31._16_4_ * 1.9073486e-06;
          auVar78._20_4_ = auVar31._20_4_ * 1.9073486e-06;
          auVar78._24_4_ = auVar31._24_4_ * 1.9073486e-06;
          auVar78._28_4_ = auVar31._28_4_;
          auVar31 = vandps_avx(auVar364,local_480);
          auVar31 = vcmpps_avx(auVar31,auVar78,1);
          auVar284._8_4_ = 0xff800000;
          auVar284._0_8_ = 0xff800000ff800000;
          auVar284._12_4_ = 0xff800000;
          auVar284._16_4_ = 0xff800000;
          auVar284._20_4_ = 0xff800000;
          auVar284._24_4_ = 0xff800000;
          auVar284._28_4_ = 0xff800000;
          auVar281 = vblendvps_avx(auVar284,auVar72,auVar30);
          auVar34 = auVar30 & auVar31;
          if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar34 >> 0x7f,0) != '\0') ||
                (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar34 >> 0xbf,0) != '\0') ||
              (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar34[0x1f] < '\0') {
            auVar119 = vandps_avx(auVar31,auVar30);
            auVar208 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
            auVar34 = vcmpps_avx(local_9c0,ZEXT832(0) << 0x20,2);
            auVar406._8_4_ = 0xff800000;
            auVar406._0_8_ = 0xff800000ff800000;
            auVar406._12_4_ = 0xff800000;
            auVar406._16_4_ = 0xff800000;
            auVar406._20_4_ = 0xff800000;
            auVar406._24_4_ = 0xff800000;
            auVar406._28_4_ = 0xff800000;
            auVar394._8_4_ = 0x7f800000;
            auVar394._0_8_ = 0x7f8000007f800000;
            auVar394._12_4_ = 0x7f800000;
            auVar394._16_4_ = 0x7f800000;
            auVar394._20_4_ = 0x7f800000;
            auVar394._24_4_ = 0x7f800000;
            auVar394._28_4_ = 0x7f800000;
            auVar31 = vblendvps_avx(auVar394,auVar406,auVar34);
            auVar214 = vpmovsxwd_avx(auVar208);
            auVar383 = ZEXT1664(auVar214);
            auVar208 = vpunpckhwd_avx(auVar208,auVar208);
            auVar366._16_16_ = auVar208;
            auVar366._0_16_ = auVar214;
            auVar258 = vblendvps_avx(auVar258,auVar31,auVar366);
            auVar31 = vblendvps_avx(auVar406,auVar394,auVar34);
            auVar281 = vblendvps_avx(auVar281,auVar31,auVar366);
            auVar31 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar131._0_4_ = auVar31._0_4_ ^ auVar119._0_4_;
            auVar131._4_4_ = auVar31._4_4_ ^ auVar119._4_4_;
            auVar131._8_4_ = auVar31._8_4_ ^ auVar119._8_4_;
            auVar131._12_4_ = auVar31._12_4_ ^ auVar119._12_4_;
            auVar131._16_4_ = auVar31._16_4_ ^ auVar119._16_4_;
            auVar131._20_4_ = auVar31._20_4_ ^ auVar119._20_4_;
            auVar131._24_4_ = auVar31._24_4_ ^ auVar119._24_4_;
            auVar131._28_4_ = auVar31._28_4_ ^ auVar119._28_4_;
            auVar119 = vorps_avx(auVar34,auVar131);
            auVar119 = vandps_avx(auVar30,auVar119);
          }
          auVar371 = ZEXT3264(auVar218);
          _local_a40 = auVar188;
        }
        auVar367 = ZEXT3264(_local_900);
        fStack_59c = (ray->dir).field_0.m128[0];
        local_8e0._0_4_ = (ray->dir).field_0.m128[1];
        fVar101 = (ray->dir).field_0.m128[2];
        auVar343._4_4_ = fVar101;
        auVar343._0_4_ = fVar101;
        auVar343._8_4_ = fVar101;
        auVar343._12_4_ = fVar101;
        auVar343._16_4_ = fVar101;
        auVar343._20_4_ = fVar101;
        auVar343._24_4_ = fVar101;
        fStack_904 = fVar101;
        _local_920 = auVar343;
        auVar345 = ZEXT3264(_local_920);
        local_4c0 = _local_900;
        local_4a0 = vminps_avx(local_4e0,auVar258);
        local_680 = vmaxps_avx(_local_900,auVar281);
        auVar285 = ZEXT3264(local_680);
        _local_500 = local_680;
        auVar31 = vcmpps_avx(_local_900,local_4a0,2);
        local_660 = vandps_avx(auVar118,auVar31);
        auVar31 = vcmpps_avx(local_680,local_4e0,2);
        local_5c0 = vandps_avx(auVar118,auVar31);
        auVar118 = vorps_avx(local_5c0,local_660);
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          auVar118 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_7e0._0_4_ = auVar119._0_4_ ^ auVar118._0_4_;
          local_7e0._4_4_ = auVar119._4_4_ ^ auVar118._4_4_;
          local_7e0._8_4_ = auVar119._8_4_ ^ auVar118._8_4_;
          local_7e0._12_4_ = auVar119._12_4_ ^ auVar118._12_4_;
          local_7e0._16_4_ = auVar119._16_4_ ^ auVar118._16_4_;
          local_7e0._20_4_ = auVar119._20_4_ ^ auVar118._20_4_;
          local_7e0._24_4_ = auVar119._24_4_ ^ auVar118._24_4_;
          local_7e0._28_4_ = (uint)auVar119._28_4_ ^ auVar118._28_4_;
          local_5a0 = fStack_59c;
          fStack_598 = fStack_59c;
          fStack_594 = fStack_59c;
          fStack_590 = fStack_59c;
          fStack_58c = fStack_59c;
          fStack_588 = fStack_59c;
          fStack_584 = fStack_59c;
          auVar126._0_4_ =
               auVar188._0_4_ * fStack_59c +
               auVar371._0_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._0_4_;
          auVar126._4_4_ =
               auVar188._4_4_ * fStack_59c +
               auVar371._4_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._4_4_;
          auVar126._8_4_ =
               auVar188._8_4_ * fStack_59c +
               auVar371._8_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._8_4_;
          auVar126._12_4_ =
               auVar188._12_4_ * fStack_59c +
               auVar371._12_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._12_4_;
          auVar126._16_4_ =
               auVar188._16_4_ * fStack_59c +
               auVar371._16_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._16_4_;
          auVar126._20_4_ =
               auVar188._20_4_ * fStack_59c +
               auVar371._20_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._20_4_;
          auVar126._24_4_ =
               auVar188._24_4_ * fStack_59c +
               auVar371._24_4_ * (float)local_8e0._0_4_ + fVar101 * auVar217._24_4_;
          auVar126._28_4_ = fStack_59c + auVar119._28_4_ + auVar188._28_4_;
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar154._16_4_ = 0x7fffffff;
          auVar154._20_4_ = 0x7fffffff;
          auVar154._24_4_ = 0x7fffffff;
          auVar154._28_4_ = 0x7fffffff;
          auVar118 = vandps_avx(auVar126,auVar154);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar118 = vcmpps_avx(auVar118,auVar155,1);
          auVar118 = vorps_avx(auVar118,local_7e0);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar192._8_4_ = 2;
          auVar192._0_8_ = 0x200000002;
          auVar192._12_4_ = 2;
          auVar192._16_4_ = 2;
          auVar192._20_4_ = 2;
          auVar192._24_4_ = 2;
          auVar192._28_4_ = 2;
          auVar118 = vblendvps_avx(auVar192,auVar156,auVar118);
          _local_5e0 = ZEXT432(local_b04);
          auVar214 = vpshufd_avx(ZEXT416(local_b04),0);
          fVar101 = 0.0;
          auVar208 = vpcmpgtd_avx(auVar118._16_16_,auVar214);
          local_600 = auVar214._0_4_;
          fStack_5fc = auVar214._4_4_;
          fStack_5f8 = auVar214._8_4_;
          fStack_5f4 = auVar214._12_4_;
          auVar214 = vpcmpgtd_avx(auVar118._0_16_,auVar214);
          auVar157._16_16_ = auVar208;
          auVar157._0_16_ = auVar214;
          local_580 = vblendps_avx(ZEXT1632(auVar214),auVar157,0xf0);
          local_540 = vandnps_avx(local_580,local_660);
          auVar263 = ZEXT3264(local_540);
          auVar118 = local_660 & ~local_580;
          auVar311 = ZEXT3264(local_a60);
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0x7f,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0xbf,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar118[0x1f]) {
            fVar140 = ray->tfar;
            auVar127._4_4_ = fVar140;
            auVar127._0_4_ = fVar140;
            auVar127._8_4_ = fVar140;
            auVar127._12_4_ = fVar140;
            auVar127._16_4_ = fVar140;
            auVar127._20_4_ = fVar140;
            auVar127._24_4_ = fVar140;
            auVar127._28_4_ = fVar140;
            local_8e0._4_4_ = local_8e0._0_4_;
            fStack_8d8 = (float)local_8e0._0_4_;
            fStack_8d4 = (float)local_8e0._0_4_;
            fStack_8d0 = (float)local_8e0._0_4_;
            fStack_8cc = (float)local_8e0._0_4_;
            fStack_8c8 = (float)local_8e0._0_4_;
          }
          else {
            local_7a0._4_4_ = local_a60._4_4_ + (float)local_900._4_4_;
            local_7a0._0_4_ = local_a60._0_4_ + (float)local_900._0_4_;
            fStack_798 = local_a60._8_4_ + fStack_8f8;
            fStack_794 = local_a60._12_4_ + fStack_8f4;
            fStack_790 = local_a60._16_4_ + fStack_8f0;
            fStack_78c = local_a60._20_4_ + fStack_8ec;
            fStack_788 = local_a60._24_4_ + fStack_8e8;
            fStack_784 = local_a60._28_4_ + fStack_8e4;
            local_8e0._4_4_ = local_8e0._0_4_;
            fStack_8d8 = (float)local_8e0._0_4_;
            fStack_8d4 = (float)local_8e0._0_4_;
            fStack_8d0 = (float)local_8e0._0_4_;
            fStack_8cc = (float)local_8e0._0_4_;
            fStack_8c8 = (float)local_8e0._0_4_;
            fStack_8c4 = (float)local_8e0._0_4_;
            do {
              auVar128._8_4_ = 0x7f800000;
              auVar128._0_8_ = 0x7f8000007f800000;
              auVar128._12_4_ = 0x7f800000;
              auVar128._16_4_ = 0x7f800000;
              auVar128._20_4_ = 0x7f800000;
              auVar128._24_4_ = 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar118 = auVar263._0_32_;
              auVar119 = vblendvps_avx(auVar128,_local_900,auVar118);
              auVar31 = vshufps_avx(auVar119,auVar119,0xb1);
              auVar31 = vminps_avx(auVar119,auVar31);
              auVar30 = vshufpd_avx(auVar31,auVar31,5);
              auVar31 = vminps_avx(auVar31,auVar30);
              auVar30 = vperm2f128_avx(auVar31,auVar31,1);
              auVar31 = vminps_avx(auVar31,auVar30);
              auVar119 = vcmpps_avx(auVar119,auVar31,0);
              auVar31 = auVar118 & auVar119;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar118 = vandps_avx(auVar119,auVar118);
              }
              uVar91 = vmovmskps_avx(auVar118);
              uVar94 = 0;
              if (uVar91 != 0) {
                for (; (uVar91 >> uVar94 & 1) == 0; uVar94 = uVar94 + 1) {
                }
              }
              uVar93 = (ulong)uVar94;
              *(undefined4 *)(local_540 + uVar93 * 4) = 0;
              aVar9 = (ray->dir).field_0.field_1;
              local_840 = aVar9.x;
              fStack_83c = aVar9.y;
              fStack_838 = aVar9.z;
              aStack_834 = aVar9.field_3;
              auVar208 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
              fVar101 = local_1a0[uVar93];
              uVar94 = *(uint *)(local_4c0 + uVar93 * 4);
              if (auVar208._0_4_ < 0.0) {
                fVar140 = sqrtf(auVar208._0_4_);
              }
              else {
                auVar208 = vsqrtss_avx(auVar208,auVar208);
                fVar140 = auVar208._0_4_;
              }
              auVar214 = vminps_avx(_local_960,_local_980);
              auVar208 = vmaxps_avx(_local_960,_local_980);
              auVar112 = vminps_avx(_local_970,_local_990);
              auVar183 = vminps_avx(auVar214,auVar112);
              auVar214 = vmaxps_avx(_local_970,_local_990);
              auVar112 = vmaxps_avx(auVar208,auVar214);
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar208 = vandps_avx(auVar183,auVar205);
              auVar214 = vandps_avx(auVar112,auVar205);
              auVar208 = vmaxps_avx(auVar208,auVar214);
              auVar214 = vmovshdup_avx(auVar208);
              auVar214 = vmaxss_avx(auVar214,auVar208);
              auVar208 = vshufpd_avx(auVar208,auVar208,1);
              auVar208 = vmaxss_avx(auVar208,auVar214);
              local_860 = auVar208._0_4_ * 1.9073486e-06;
              local_6c0._0_4_ = fVar140 * 1.9073486e-06;
              local_740._0_16_ = vshufps_avx(auVar112,auVar112,0xff);
              auVar208 = vinsertps_avx(ZEXT416(uVar94),ZEXT416((uint)fVar101),0x10);
              auVar345 = ZEXT1664(auVar208);
              bVar100 = true;
              uVar93 = 0;
              do {
                auVar342 = auVar345._0_16_;
                auVar214 = vmovshdup_avx(auVar342);
                fVar223 = auVar214._0_4_;
                fVar222 = 1.0 - fVar223;
                fVar101 = fVar222 * fVar222;
                fVar140 = fVar222 * fVar101;
                fVar162 = fVar223 * fVar223;
                fVar166 = fVar223 * fVar162;
                fVar201 = fVar223 * fVar222;
                auVar208 = vshufps_avx(ZEXT416((uint)(fVar166 * 0.16666667)),
                                       ZEXT416((uint)(fVar166 * 0.16666667)),0);
                auVar112 = ZEXT416((uint)((fVar166 * 4.0 + fVar140 +
                                          fVar223 * fVar201 * 12.0 + fVar222 * fVar201 * 6.0) *
                                         0.16666667));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar183 = ZEXT416((uint)((fVar140 * 4.0 + fVar166 +
                                          fVar222 * fVar201 * 12.0 + fVar223 * fVar201 * 6.0) *
                                         0.16666667));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar114 = vshufps_avx(auVar342,auVar342,0);
                auVar180._0_4_ = auVar114._0_4_ * local_840 + 0.0;
                auVar180._4_4_ = auVar114._4_4_ * fStack_83c + 0.0;
                auVar180._8_4_ = auVar114._8_4_ * fStack_838 + 0.0;
                auVar180._12_4_ = auVar114._12_4_ * aStack_834.w + 0.0;
                auVar114 = vshufps_avx(ZEXT416((uint)(fVar140 * 0.16666667)),
                                       ZEXT416((uint)(fVar140 * 0.16666667)),0);
                auVar107._0_4_ =
                     auVar114._0_4_ * (float)local_960._0_4_ +
                     auVar183._0_4_ * (float)local_980._0_4_ +
                     auVar208._0_4_ * (float)local_990._0_4_ +
                     auVar112._0_4_ * (float)local_970._0_4_;
                auVar107._4_4_ =
                     auVar114._4_4_ * (float)local_960._4_4_ +
                     auVar183._4_4_ * (float)local_980._4_4_ +
                     auVar208._4_4_ * (float)local_990._4_4_ +
                     auVar112._4_4_ * (float)local_970._4_4_;
                auVar107._8_4_ =
                     auVar114._8_4_ * fStack_958 +
                     auVar183._8_4_ * fStack_978 +
                     auVar208._8_4_ * fStack_988 + auVar112._8_4_ * fStack_968;
                auVar107._12_4_ =
                     auVar114._12_4_ * fStack_954 +
                     auVar183._12_4_ * fStack_974 +
                     auVar208._12_4_ * fStack_984 + auVar112._12_4_ * fStack_964;
                local_820._0_16_ = auVar107;
                auVar208 = vsubps_avx(auVar180,auVar107);
                _local_a40 = auVar208;
                auVar208 = vdpps_avx(auVar208,auVar208,0x7f);
                fVar140 = auVar208._0_4_;
                local_b00 = auVar345._0_4_;
                if (fVar140 < 0.0) {
                  local_9c0._0_16_ = auVar214;
                  local_9e0._0_4_ = fVar162;
                  local_a00._0_4_ = fVar101;
                  local_a20._0_4_ = fVar201;
                  auVar367._0_4_ = sqrtf(fVar140);
                  auVar367._4_60_ = extraout_var;
                  auVar112 = auVar367._0_16_;
                  fVar162 = (float)local_9e0._0_4_;
                  auVar214 = local_9c0._0_16_;
                  fVar201 = (float)local_a20._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar208,auVar208);
                  local_a00._0_4_ = fVar101;
                }
                auVar383 = ZEXT1664(auVar214);
                auVar367 = ZEXT1664(auVar112);
                fVar101 = auVar214._0_4_;
                auVar183 = vshufps_avx(ZEXT416((uint)(fVar162 * 0.5)),ZEXT416((uint)(fVar162 * 0.5))
                                       ,0);
                auVar114 = ZEXT416((uint)(((float)local_a00._0_4_ + fVar201 * 4.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar147 = ZEXT416((uint)((fVar101 * -fVar101 - fVar201 * 4.0) * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar113 = ZEXT416((uint)(fVar222 * -fVar222 * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar327._0_4_ =
                     (float)local_960._0_4_ * auVar113._0_4_ +
                     (float)local_980._0_4_ * auVar147._0_4_ +
                     (float)local_990._0_4_ * auVar183._0_4_ +
                     (float)local_970._0_4_ * auVar114._0_4_;
                auVar327._4_4_ =
                     (float)local_960._4_4_ * auVar113._4_4_ +
                     (float)local_980._4_4_ * auVar147._4_4_ +
                     (float)local_990._4_4_ * auVar183._4_4_ +
                     (float)local_970._4_4_ * auVar114._4_4_;
                auVar327._8_4_ =
                     fStack_958 * auVar113._8_4_ +
                     fStack_978 * auVar147._8_4_ +
                     fStack_988 * auVar183._8_4_ + fStack_968 * auVar114._8_4_;
                auVar327._12_4_ =
                     fStack_954 * auVar113._12_4_ +
                     fStack_974 * auVar147._12_4_ +
                     fStack_984 * auVar183._12_4_ + fStack_964 * auVar114._12_4_;
                auVar183 = vshufps_avx(auVar342,auVar342,0x55);
                auVar114 = ZEXT416((uint)(fVar222 - (fVar101 + fVar101)));
                auVar147 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = ZEXT416((uint)(fVar101 - (fVar222 + fVar222)));
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar150 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                auVar114 = vdpps_avx(auVar327,auVar327,0x7f);
                auVar145._0_4_ =
                     (float)local_960._0_4_ * auVar150._0_4_ +
                     (float)local_980._0_4_ * auVar113._0_4_ +
                     (float)local_990._0_4_ * auVar183._0_4_ +
                     (float)local_970._0_4_ * auVar147._0_4_;
                auVar145._4_4_ =
                     (float)local_960._4_4_ * auVar150._4_4_ +
                     (float)local_980._4_4_ * auVar113._4_4_ +
                     (float)local_990._4_4_ * auVar183._4_4_ +
                     (float)local_970._4_4_ * auVar147._4_4_;
                auVar145._8_4_ =
                     fStack_958 * auVar150._8_4_ +
                     fStack_978 * auVar113._8_4_ +
                     fStack_988 * auVar183._8_4_ + fStack_968 * auVar147._8_4_;
                auVar145._12_4_ =
                     fStack_954 * auVar150._12_4_ +
                     fStack_974 * auVar113._12_4_ +
                     fStack_984 * auVar183._12_4_ + fStack_964 * auVar147._12_4_;
                auVar183 = vblendps_avx(auVar114,_DAT_01f7aa10,0xe);
                auVar147 = vrsqrtss_avx(auVar183,auVar183);
                fVar162 = auVar147._0_4_;
                fVar101 = auVar114._0_4_;
                auVar147 = vdpps_avx(auVar327,auVar145,0x7f);
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar146._0_4_ = auVar145._0_4_ * auVar113._0_4_;
                auVar146._4_4_ = auVar145._4_4_ * auVar113._4_4_;
                auVar146._8_4_ = auVar145._8_4_ * auVar113._8_4_;
                auVar146._12_4_ = auVar145._12_4_ * auVar113._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar230._0_4_ = auVar327._0_4_ * auVar147._0_4_;
                auVar230._4_4_ = auVar327._4_4_ * auVar147._4_4_;
                auVar230._8_4_ = auVar327._8_4_ * auVar147._8_4_;
                auVar230._12_4_ = auVar327._12_4_ * auVar147._12_4_;
                auVar150 = vsubps_avx(auVar146,auVar230);
                auVar147 = vrcpss_avx(auVar183,auVar183);
                auVar183 = vmaxss_avx(ZEXT416((uint)local_860),
                                      ZEXT416((uint)(local_b00 * (float)local_6c0._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar101 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar79 = CONCAT44(auVar327._4_4_,auVar327._0_4_);
                local_a00._0_8_ = uVar79 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar327._8_4_;
                local_a00._12_4_ = -auVar327._12_4_;
                auVar113 = ZEXT416((uint)(fVar162 * 1.5 +
                                         fVar101 * -0.5 * fVar162 * fVar162 * fVar162));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar206._0_4_ = auVar113._0_4_ * auVar150._0_4_ * auVar147._0_4_;
                auVar206._4_4_ = auVar113._4_4_ * auVar150._4_4_ * auVar147._4_4_;
                auVar206._8_4_ = auVar113._8_4_ * auVar150._8_4_ * auVar147._8_4_;
                auVar206._12_4_ = auVar113._12_4_ * auVar150._12_4_ * auVar147._12_4_;
                auVar277._0_4_ = auVar327._0_4_ * auVar113._0_4_;
                auVar277._4_4_ = auVar327._4_4_ * auVar113._4_4_;
                auVar277._8_4_ = auVar327._8_4_ * auVar113._8_4_;
                auVar277._12_4_ = auVar327._12_4_ * auVar113._12_4_;
                local_9c0._0_4_ = auVar183._0_4_;
                if (fVar101 < 0.0) {
                  local_9e0._0_4_ = auVar112._0_4_;
                  local_a20._0_16_ = auVar277;
                  local_880._0_16_ = auVar206;
                  auVar383 = ZEXT1664(auVar214);
                  fVar162 = sqrtf(fVar101);
                  auVar367 = ZEXT464((uint)local_9e0._0_4_);
                  auVar206 = local_880._0_16_;
                  auVar277 = local_a20._0_16_;
                  fVar101 = (float)local_9c0._0_4_;
                }
                else {
                  auVar214 = vsqrtss_avx(auVar114,auVar114);
                  fVar162 = auVar214._0_4_;
                  fVar101 = auVar183._0_4_;
                }
                auVar214 = vdpps_avx(_local_a40,auVar277,0x7f);
                local_9e0._0_4_ =
                     (local_860 / fVar162) * (auVar367._0_4_ + 1.0) +
                     auVar367._0_4_ * local_860 + fVar101;
                auVar112 = vdpps_avx(local_a00._0_16_,auVar277,0x7f);
                auVar183 = vdpps_avx(_local_a40,auVar206,0x7f);
                auVar83._4_4_ = fStack_83c;
                auVar83._0_4_ = local_840;
                auVar83._8_4_ = fStack_838;
                auVar83._12_4_ = aStack_834.a;
                auVar114 = vdpps_avx(auVar83,auVar277,0x7f);
                auVar147 = vdpps_avx(_local_a40,local_a00._0_16_,0x7f);
                fVar162 = auVar112._0_4_ + auVar183._0_4_;
                fVar166 = auVar214._0_4_;
                auVar108._0_4_ = fVar166 * fVar166;
                auVar108._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                auVar108._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                auVar108._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                auVar183 = vsubps_avx(auVar208,auVar108);
                local_a00._0_16_ = ZEXT416((uint)fVar162);
                auVar112 = vdpps_avx(_local_a40,auVar83,0x7f);
                fVar201 = auVar147._0_4_ - fVar166 * fVar162;
                fVar166 = auVar112._0_4_ - fVar166 * auVar114._0_4_;
                auVar112 = vrsqrtss_avx(auVar183,auVar183);
                fVar222 = auVar183._0_4_;
                fVar162 = auVar112._0_4_;
                fVar162 = fVar162 * 1.5 + fVar222 * -0.5 * fVar162 * fVar162 * fVar162;
                if (fVar222 < 0.0) {
                  local_a20._0_16_ = auVar214;
                  local_880._0_16_ = auVar114;
                  local_6e0._0_4_ = fVar201;
                  local_700._0_4_ = fVar166;
                  local_720._0_4_ = fVar162;
                  auVar367 = ZEXT1664(auVar367._0_16_);
                  auVar383 = ZEXT1664(auVar383._0_16_);
                  fVar222 = sqrtf(fVar222);
                  fVar162 = (float)local_720._0_4_;
                  fVar201 = (float)local_6e0._0_4_;
                  fVar166 = (float)local_700._0_4_;
                  auVar114 = local_880._0_16_;
                  auVar214 = local_a20._0_16_;
                  fVar101 = (float)local_9c0._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar183,auVar183);
                  fVar222 = auVar112._0_4_;
                }
                auVar371 = ZEXT1664(auVar327);
                auVar147 = vpermilps_avx(local_820._0_16_,0xff);
                auVar113 = vshufps_avx(auVar327,auVar327,0xff);
                fVar223 = fVar201 * fVar162 - auVar113._0_4_;
                auVar231._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
                auVar231._8_4_ = auVar114._8_4_ ^ 0x80000000;
                auVar231._12_4_ = auVar114._12_4_ ^ 0x80000000;
                auVar254._0_4_ = -fVar223;
                auVar254._4_4_ = 0x80000000;
                auVar254._8_4_ = 0x80000000;
                auVar254._12_4_ = 0x80000000;
                fVar201 = local_a00._0_4_ * fVar166 * fVar162;
                auVar285 = ZEXT464((uint)fVar201);
                auVar112 = vinsertps_avx(auVar254,ZEXT416((uint)(fVar166 * fVar162)),0x1c);
                auVar114 = vmovsldup_avx(ZEXT416((uint)(fVar201 - auVar114._0_4_ * fVar223)));
                auVar112 = vdivps_avx(auVar112,auVar114);
                auVar183 = vinsertps_avx(local_a00._0_16_,auVar231,0x10);
                auVar183 = vdivps_avx(auVar183,auVar114);
                auVar114 = vmovsldup_avx(auVar214);
                auVar150 = ZEXT416((uint)(fVar222 - auVar147._0_4_));
                auVar147 = vmovsldup_avx(auVar150);
                auVar181._0_4_ = auVar114._0_4_ * auVar112._0_4_ + auVar147._0_4_ * auVar183._0_4_;
                auVar181._4_4_ = auVar114._4_4_ * auVar112._4_4_ + auVar147._4_4_ * auVar183._4_4_;
                auVar181._8_4_ = auVar114._8_4_ * auVar112._8_4_ + auVar147._8_4_ * auVar183._8_4_;
                auVar181._12_4_ =
                     auVar114._12_4_ * auVar112._12_4_ + auVar147._12_4_ * auVar183._12_4_;
                auVar112 = vsubps_avx(auVar342,auVar181);
                auVar345 = ZEXT1664(auVar112);
                auVar182._8_4_ = 0x7fffffff;
                auVar182._0_8_ = 0x7fffffff7fffffff;
                auVar182._12_4_ = 0x7fffffff;
                auVar214 = vandps_avx(auVar214,auVar182);
                if (auVar214._0_4_ < (float)local_9e0._0_4_) {
                  auVar207._8_4_ = 0x7fffffff;
                  auVar207._0_8_ = 0x7fffffff7fffffff;
                  auVar207._12_4_ = 0x7fffffff;
                  auVar214 = vandps_avx(auVar150,auVar207);
                  if (auVar214._0_4_ <
                      (float)local_740._0_4_ * 1.9073486e-06 + fVar101 + (float)local_9e0._0_4_) {
                    fVar101 = auVar112._0_4_ + (float)local_800._0_4_;
                    bVar89 = 0;
                    bVar88 = 0;
                    if (fVar101 < (ray->org).field_0.m128[3]) goto LAB_00f33d83;
                    fVar162 = ray->tfar;
                    auVar311 = ZEXT3264(local_a60);
                    auVar343 = local_920._0_28_;
                    if (fVar162 < fVar101) goto LAB_00f33d9e;
                    auVar214 = vmovshdup_avx(auVar112);
                    bVar89 = 0;
                    fVar166 = auVar214._0_4_;
                    if ((fVar166 < 0.0) || (1.0 < fVar166)) goto LAB_00f33d9e;
                    auVar208 = vrsqrtss_avx(auVar208,auVar208);
                    fVar222 = auVar208._0_4_;
                    pGVar13 = (context->scene->geometries).items[uVar90].ptr;
                    if ((pGVar13->mask & ray->mask) == 0) {
                      bVar89 = 0;
                      goto LAB_00f33d8c;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar89 = 1, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_00f33d8c;
                    auVar208 = ZEXT416((uint)(fVar222 * 1.5 +
                                             fVar140 * -0.5 * fVar222 * fVar222 * fVar222));
                    auVar208 = vshufps_avx(auVar208,auVar208,0);
                    auVar209._0_4_ = auVar208._0_4_ * (float)local_a40._0_4_;
                    auVar209._4_4_ = auVar208._4_4_ * (float)local_a40._4_4_;
                    auVar209._8_4_ = auVar208._8_4_ * fStack_a38;
                    auVar209._12_4_ = auVar208._12_4_ * fStack_a34;
                    auVar109._0_4_ = auVar327._0_4_ + auVar113._0_4_ * auVar209._0_4_;
                    auVar109._4_4_ = auVar327._4_4_ + auVar113._4_4_ * auVar209._4_4_;
                    auVar109._8_4_ = auVar327._8_4_ + auVar113._8_4_ * auVar209._8_4_;
                    auVar109._12_4_ = auVar327._12_4_ + auVar113._12_4_ * auVar209._12_4_;
                    auVar208 = vshufps_avx(auVar209,auVar209,0xc9);
                    auVar214 = vshufps_avx(auVar327,auVar327,0xc9);
                    auVar210._0_4_ = auVar214._0_4_ * auVar209._0_4_;
                    auVar210._4_4_ = auVar214._4_4_ * auVar209._4_4_;
                    auVar210._8_4_ = auVar214._8_4_ * auVar209._8_4_;
                    auVar210._12_4_ = auVar214._12_4_ * auVar209._12_4_;
                    auVar232._0_4_ = auVar327._0_4_ * auVar208._0_4_;
                    auVar232._4_4_ = auVar327._4_4_ * auVar208._4_4_;
                    auVar232._8_4_ = auVar327._8_4_ * auVar208._8_4_;
                    auVar232._12_4_ = auVar327._12_4_ * auVar208._12_4_;
                    auVar183 = vsubps_avx(auVar232,auVar210);
                    auVar208 = vshufps_avx(auVar183,auVar183,0xc9);
                    auVar214 = vshufps_avx(auVar109,auVar109,0xc9);
                    auVar233._0_4_ = auVar214._0_4_ * auVar208._0_4_;
                    auVar233._4_4_ = auVar214._4_4_ * auVar208._4_4_;
                    auVar233._8_4_ = auVar214._8_4_ * auVar208._8_4_;
                    auVar233._12_4_ = auVar214._12_4_ * auVar208._12_4_;
                    auVar208 = vshufps_avx(auVar183,auVar183,0xd2);
                    auVar110._0_4_ = auVar109._0_4_ * auVar208._0_4_;
                    auVar110._4_4_ = auVar109._4_4_ * auVar208._4_4_;
                    auVar110._8_4_ = auVar109._8_4_ * auVar208._8_4_;
                    auVar110._12_4_ = auVar109._12_4_ * auVar208._12_4_;
                    auVar214 = vsubps_avx(auVar233,auVar110);
                    auVar208 = vshufps_avx(auVar214,auVar214,0xe9);
                    local_8c0 = vmovlps_avx(auVar208);
                    local_8b8 = auVar214._0_4_;
                    local_8b0 = 0;
                    local_8ac = (undefined4)local_888;
                    local_8a4 = context->user->instID[0];
                    local_8a0 = context->user->instPrimID[0];
                    ray->tfar = fVar101;
                    local_6a0._0_4_ = 0xffffffff;
                    local_950.valid = (int *)local_6a0;
                    local_950.geometryUserPtr = pGVar13->userPtr;
                    local_950.context = context->user;
                    local_950.hit = (RTCHitN *)&local_8c0;
                    local_950.N = 1;
                    local_950.ray = (RTCRayN *)ray;
                    local_8b4 = fVar166;
                    local_8a8 = uVar90;
                    if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f33fd4:
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        auVar367 = ZEXT1664(auVar367._0_16_);
                        auVar371 = ZEXT1664(auVar371._0_16_);
                        auVar383 = ZEXT1664(auVar383._0_16_);
                        (*p_Var17)(&local_950);
                        if (*local_950.valid == 0) goto LAB_00f3401b;
                      }
                      bVar88 = 1;
                    }
                    else {
                      auVar285 = ZEXT464((uint)fVar201);
                      auVar345 = ZEXT1664(auVar112);
                      auVar367 = ZEXT1664(auVar367._0_16_);
                      auVar371 = ZEXT1664(auVar327);
                      auVar383 = ZEXT1664(auVar383._0_16_);
                      (*pGVar13->occlusionFilterN)(&local_950);
                      if (*local_950.valid != 0) goto LAB_00f33fd4;
LAB_00f3401b:
                      ray->tfar = fVar162;
                      bVar88 = 0;
                    }
                    goto LAB_00f33d83;
                  }
                }
                bVar100 = uVar93 < 4;
                uVar93 = uVar93 + 1;
              } while (uVar93 != 5);
              bVar100 = false;
              bVar88 = 5;
LAB_00f33d83:
              bVar89 = bVar88;
              auVar311 = ZEXT3264(local_a60);
LAB_00f33d8c:
              auVar343 = local_920._0_28_;
LAB_00f33d9e:
              bVar97 = (bool)(bVar97 | bVar100 & bVar89);
              fVar101 = ray->tfar;
              auVar127._4_4_ = fVar101;
              auVar127._0_4_ = fVar101;
              auVar127._8_4_ = fVar101;
              auVar127._12_4_ = fVar101;
              auVar127._16_4_ = fVar101;
              auVar127._20_4_ = fVar101;
              auVar127._24_4_ = fVar101;
              auVar127._28_4_ = fVar101;
              auVar119 = vcmpps_avx(_local_7a0,auVar127,2);
              fVar101 = auVar119._28_4_;
              auVar118 = vandps_avx(auVar119,local_540);
              auVar263 = ZEXT3264(auVar118);
              auVar119 = local_540 & auVar119;
              local_540 = auVar118;
            } while ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar119 >> 0x7f,0) != '\0') ||
                       (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar119 >> 0xbf,0) != '\0') ||
                     (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar119[0x1f] < '\0');
          }
          auVar331 = ZEXT3264(_local_500);
          auVar158._0_4_ =
               local_5a0 * (float)local_620._0_4_ +
               (float)local_8e0._0_4_ * (float)local_640._0_4_ +
               auVar343._0_4_ * (float)local_7c0._0_4_;
          auVar158._4_4_ =
               fStack_59c * (float)local_620._4_4_ +
               (float)local_8e0._4_4_ * (float)local_640._4_4_ +
               auVar343._4_4_ * (float)local_7c0._4_4_;
          auVar158._8_4_ =
               fStack_598 * fStack_618 + fStack_8d8 * fStack_638 + auVar343._8_4_ * fStack_7b8;
          auVar158._12_4_ =
               fStack_594 * fStack_614 + fStack_8d4 * fStack_634 + auVar343._12_4_ * fStack_7b4;
          auVar158._16_4_ =
               fStack_590 * fStack_610 + fStack_8d0 * fStack_630 + auVar343._16_4_ * fStack_7b0;
          auVar158._20_4_ =
               fStack_58c * fStack_60c + fStack_8cc * fStack_62c + auVar343._20_4_ * fStack_7ac;
          auVar158._24_4_ =
               fStack_588 * fStack_608 + fStack_8c8 * fStack_628 + auVar343._24_4_ * fStack_7a8;
          auVar158._28_4_ = fStack_584 + fVar101 + auVar263._28_4_;
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar193._16_4_ = 0x7fffffff;
          auVar193._20_4_ = 0x7fffffff;
          auVar193._24_4_ = 0x7fffffff;
          auVar193._28_4_ = 0x7fffffff;
          auVar118 = vandps_avx(auVar158,auVar193);
          auVar194._8_4_ = 0x3e99999a;
          auVar194._0_8_ = 0x3e99999a3e99999a;
          auVar194._12_4_ = 0x3e99999a;
          auVar194._16_4_ = 0x3e99999a;
          auVar194._20_4_ = 0x3e99999a;
          auVar194._24_4_ = 0x3e99999a;
          auVar194._28_4_ = 0x3e99999a;
          auVar118 = vcmpps_avx(auVar118,auVar194,1);
          auVar119 = vorps_avx(auVar118,local_7e0);
          auVar195._0_4_ = auVar311._0_4_ + local_680._0_4_;
          auVar195._4_4_ = auVar311._4_4_ + local_680._4_4_;
          auVar195._8_4_ = auVar311._8_4_ + local_680._8_4_;
          auVar195._12_4_ = auVar311._12_4_ + local_680._12_4_;
          auVar195._16_4_ = auVar311._16_4_ + local_680._16_4_;
          auVar195._20_4_ = auVar311._20_4_ + local_680._20_4_;
          auVar195._24_4_ = auVar311._24_4_ + local_680._24_4_;
          auVar195._28_4_ = auVar311._28_4_ + local_680._28_4_;
          auVar118 = vcmpps_avx(auVar195,auVar127,2);
          _local_7a0 = vandps_avx(auVar118,local_5c0);
          auVar196._8_4_ = 3;
          auVar196._0_8_ = 0x300000003;
          auVar196._12_4_ = 3;
          auVar196._16_4_ = 3;
          auVar196._20_4_ = 3;
          auVar196._24_4_ = 3;
          auVar196._28_4_ = 3;
          auVar221._8_4_ = 2;
          auVar221._0_8_ = 0x200000002;
          auVar221._12_4_ = 2;
          auVar221._16_4_ = 2;
          auVar221._20_4_ = 2;
          auVar221._24_4_ = 2;
          auVar221._28_4_ = 2;
          auVar118 = vblendvps_avx(auVar221,auVar196,auVar119);
          auVar86._4_4_ = fStack_5fc;
          auVar86._0_4_ = local_600;
          auVar86._8_4_ = fStack_5f8;
          auVar86._12_4_ = fStack_5f4;
          auVar208 = vpcmpgtd_avx(auVar118._16_16_,auVar86);
          auVar214 = vpshufd_avx(_local_5e0,0);
          auVar214 = vpcmpgtd_avx(auVar118._0_16_,auVar214);
          auVar197._16_16_ = auVar208;
          auVar197._0_16_ = auVar127._0_16_;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar214),auVar197,0xf0);
          auVar118 = vandnps_avx(_local_8e0,_local_7a0);
          auVar119 = _local_7a0 & ~_local_8e0;
          local_6a0 = auVar118;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            local_920._4_4_ = local_500._4_4_ + auVar311._4_4_;
            local_920._0_4_ = local_500._0_4_ + auVar311._0_4_;
            fStack_918 = local_500._8_4_ + auVar311._8_4_;
            fStack_914 = local_500._12_4_ + auVar311._12_4_;
            fStack_910 = local_500._16_4_ + auVar311._16_4_;
            fStack_90c = local_500._20_4_ + auVar311._20_4_;
            fStack_908 = local_500._24_4_ + auVar311._24_4_;
            fStack_904 = local_500._28_4_ + auVar311._28_4_;
            _local_900 = _local_500;
            do {
              auVar129._8_4_ = 0x7f800000;
              auVar129._0_8_ = 0x7f8000007f800000;
              auVar129._12_4_ = 0x7f800000;
              auVar129._16_4_ = 0x7f800000;
              auVar129._20_4_ = 0x7f800000;
              auVar129._24_4_ = 0x7f800000;
              auVar129._28_4_ = 0x7f800000;
              auVar119 = vblendvps_avx(auVar129,auVar331._0_32_,auVar118);
              auVar31 = vshufps_avx(auVar119,auVar119,0xb1);
              auVar31 = vminps_avx(auVar119,auVar31);
              auVar30 = vshufpd_avx(auVar31,auVar31,5);
              auVar31 = vminps_avx(auVar31,auVar30);
              auVar30 = vperm2f128_avx(auVar31,auVar31,1);
              auVar31 = vminps_avx(auVar31,auVar30);
              auVar31 = vcmpps_avx(auVar119,auVar31,0);
              auVar30 = auVar118 & auVar31;
              auVar119 = auVar118;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar119 = vandps_avx(auVar31,auVar118);
              }
              uVar91 = vmovmskps_avx(auVar119);
              uVar94 = 0;
              if (uVar91 != 0) {
                for (; (uVar91 >> uVar94 & 1) == 0; uVar94 = uVar94 + 1) {
                }
              }
              uVar93 = (ulong)uVar94;
              local_6a0 = auVar118;
              *(undefined4 *)(local_6a0 + uVar93 * 4) = 0;
              aVar9 = (ray->dir).field_0.field_1;
              local_840 = aVar9.x;
              fStack_83c = aVar9.y;
              fStack_838 = aVar9.z;
              aStack_834 = aVar9.field_3;
              auVar208 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
              fVar101 = local_1c0[uVar93];
              uVar94 = *(uint *)(local_4e0 + uVar93 * 4);
              if (auVar208._0_4_ < 0.0) {
                fVar140 = sqrtf(auVar208._0_4_);
              }
              else {
                auVar208 = vsqrtss_avx(auVar208,auVar208);
                fVar140 = auVar208._0_4_;
              }
              auVar214 = vminps_avx(_local_960,_local_980);
              auVar208 = vmaxps_avx(_local_960,_local_980);
              auVar112 = vminps_avx(_local_970,_local_990);
              auVar183 = vminps_avx(auVar214,auVar112);
              auVar214 = vmaxps_avx(_local_970,_local_990);
              auVar112 = vmaxps_avx(auVar208,auVar214);
              auVar211._8_4_ = 0x7fffffff;
              auVar211._0_8_ = 0x7fffffff7fffffff;
              auVar211._12_4_ = 0x7fffffff;
              auVar208 = vandps_avx(auVar183,auVar211);
              auVar214 = vandps_avx(auVar112,auVar211);
              auVar208 = vmaxps_avx(auVar208,auVar214);
              auVar214 = vmovshdup_avx(auVar208);
              auVar214 = vmaxss_avx(auVar214,auVar208);
              auVar208 = vshufpd_avx(auVar208,auVar208,1);
              auVar208 = vmaxss_avx(auVar208,auVar214);
              local_860 = auVar208._0_4_ * 1.9073486e-06;
              local_6c0._0_4_ = fVar140 * 1.9073486e-06;
              local_740._0_16_ = vshufps_avx(auVar112,auVar112,0xff);
              auVar208 = vinsertps_avx(ZEXT416(uVar94),ZEXT416((uint)fVar101),0x10);
              auVar345 = ZEXT1664(auVar208);
              bVar100 = true;
              uVar93 = 0;
              do {
                auVar342 = auVar345._0_16_;
                auVar214 = vmovshdup_avx(auVar342);
                fVar223 = auVar214._0_4_;
                fVar222 = 1.0 - fVar223;
                fVar101 = fVar222 * fVar222;
                fVar140 = fVar222 * fVar101;
                fVar162 = fVar223 * fVar223;
                fVar166 = fVar223 * fVar162;
                fVar201 = fVar223 * fVar222;
                auVar208 = vshufps_avx(ZEXT416((uint)(fVar166 * 0.16666667)),
                                       ZEXT416((uint)(fVar166 * 0.16666667)),0);
                auVar112 = ZEXT416((uint)((fVar166 * 4.0 + fVar140 +
                                          fVar223 * fVar201 * 12.0 + fVar222 * fVar201 * 6.0) *
                                         0.16666667));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar183 = ZEXT416((uint)((fVar140 * 4.0 + fVar166 +
                                          fVar222 * fVar201 * 12.0 + fVar223 * fVar201 * 6.0) *
                                         0.16666667));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar114 = vshufps_avx(auVar342,auVar342,0);
                auVar184._0_4_ = auVar114._0_4_ * local_840 + 0.0;
                auVar184._4_4_ = auVar114._4_4_ * fStack_83c + 0.0;
                auVar184._8_4_ = auVar114._8_4_ * fStack_838 + 0.0;
                auVar184._12_4_ = auVar114._12_4_ * aStack_834.w + 0.0;
                auVar114 = vshufps_avx(ZEXT416((uint)(fVar140 * 0.16666667)),
                                       ZEXT416((uint)(fVar140 * 0.16666667)),0);
                auVar111._0_4_ =
                     auVar114._0_4_ * (float)local_960._0_4_ +
                     auVar183._0_4_ * (float)local_980._0_4_ +
                     auVar208._0_4_ * (float)local_990._0_4_ +
                     auVar112._0_4_ * (float)local_970._0_4_;
                auVar111._4_4_ =
                     auVar114._4_4_ * (float)local_960._4_4_ +
                     auVar183._4_4_ * (float)local_980._4_4_ +
                     auVar208._4_4_ * (float)local_990._4_4_ +
                     auVar112._4_4_ * (float)local_970._4_4_;
                auVar111._8_4_ =
                     auVar114._8_4_ * fStack_958 +
                     auVar183._8_4_ * fStack_978 +
                     auVar208._8_4_ * fStack_988 + auVar112._8_4_ * fStack_968;
                auVar111._12_4_ =
                     auVar114._12_4_ * fStack_954 +
                     auVar183._12_4_ * fStack_974 +
                     auVar208._12_4_ * fStack_984 + auVar112._12_4_ * fStack_964;
                local_820._0_16_ = auVar111;
                auVar208 = vsubps_avx(auVar184,auVar111);
                _local_a40 = auVar208;
                auVar208 = vdpps_avx(auVar208,auVar208,0x7f);
                fVar140 = auVar208._0_4_;
                local_b00 = auVar345._0_4_;
                if (fVar140 < 0.0) {
                  local_9c0._0_16_ = auVar214;
                  local_9e0._0_4_ = fVar162;
                  local_a00._0_4_ = fVar101;
                  local_a20._0_4_ = fVar201;
                  auVar371._0_4_ = sqrtf(fVar140);
                  auVar371._4_60_ = extraout_var_00;
                  auVar112 = auVar371._0_16_;
                  auVar214 = local_9c0._0_16_;
                  fVar162 = (float)local_9e0._0_4_;
                  fVar201 = (float)local_a20._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar208,auVar208);
                  local_a00._0_4_ = fVar101;
                }
                auVar383 = ZEXT1664(auVar214);
                auVar367 = ZEXT1664(auVar112);
                fVar101 = auVar214._0_4_;
                auVar183 = vshufps_avx(ZEXT416((uint)(fVar162 * 0.5)),ZEXT416((uint)(fVar162 * 0.5))
                                       ,0);
                auVar114 = ZEXT416((uint)(((float)local_a00._0_4_ + fVar201 * 4.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar147 = ZEXT416((uint)((fVar101 * -fVar101 - fVar201 * 4.0) * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar113 = ZEXT416((uint)(fVar222 * -fVar222 * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar328._0_4_ =
                     (float)local_960._0_4_ * auVar113._0_4_ +
                     (float)local_980._0_4_ * auVar147._0_4_ +
                     (float)local_990._0_4_ * auVar183._0_4_ +
                     (float)local_970._0_4_ * auVar114._0_4_;
                auVar328._4_4_ =
                     (float)local_960._4_4_ * auVar113._4_4_ +
                     (float)local_980._4_4_ * auVar147._4_4_ +
                     (float)local_990._4_4_ * auVar183._4_4_ +
                     (float)local_970._4_4_ * auVar114._4_4_;
                auVar328._8_4_ =
                     fStack_958 * auVar113._8_4_ +
                     fStack_978 * auVar147._8_4_ +
                     fStack_988 * auVar183._8_4_ + fStack_968 * auVar114._8_4_;
                auVar328._12_4_ =
                     fStack_954 * auVar113._12_4_ +
                     fStack_974 * auVar147._12_4_ +
                     fStack_984 * auVar183._12_4_ + fStack_964 * auVar114._12_4_;
                auVar183 = vshufps_avx(auVar342,auVar342,0x55);
                auVar114 = ZEXT416((uint)(fVar222 - (fVar101 + fVar101)));
                auVar147 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = ZEXT416((uint)(fVar101 - (fVar222 + fVar222)));
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar150 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                auVar114 = vdpps_avx(auVar328,auVar328,0x7f);
                auVar148._0_4_ =
                     (float)local_960._0_4_ * auVar150._0_4_ +
                     (float)local_980._0_4_ * auVar113._0_4_ +
                     (float)local_990._0_4_ * auVar183._0_4_ +
                     (float)local_970._0_4_ * auVar147._0_4_;
                auVar148._4_4_ =
                     (float)local_960._4_4_ * auVar150._4_4_ +
                     (float)local_980._4_4_ * auVar113._4_4_ +
                     (float)local_990._4_4_ * auVar183._4_4_ +
                     (float)local_970._4_4_ * auVar147._4_4_;
                auVar148._8_4_ =
                     fStack_958 * auVar150._8_4_ +
                     fStack_978 * auVar113._8_4_ +
                     fStack_988 * auVar183._8_4_ + fStack_968 * auVar147._8_4_;
                auVar148._12_4_ =
                     fStack_954 * auVar150._12_4_ +
                     fStack_974 * auVar113._12_4_ +
                     fStack_984 * auVar183._12_4_ + fStack_964 * auVar147._12_4_;
                auVar183 = vblendps_avx(auVar114,_DAT_01f7aa10,0xe);
                auVar147 = vrsqrtss_avx(auVar183,auVar183);
                fVar162 = auVar147._0_4_;
                fVar101 = auVar114._0_4_;
                auVar147 = vdpps_avx(auVar328,auVar148,0x7f);
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar149._0_4_ = auVar148._0_4_ * auVar113._0_4_;
                auVar149._4_4_ = auVar148._4_4_ * auVar113._4_4_;
                auVar149._8_4_ = auVar148._8_4_ * auVar113._8_4_;
                auVar149._12_4_ = auVar148._12_4_ * auVar113._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar234._0_4_ = auVar328._0_4_ * auVar147._0_4_;
                auVar234._4_4_ = auVar328._4_4_ * auVar147._4_4_;
                auVar234._8_4_ = auVar328._8_4_ * auVar147._8_4_;
                auVar234._12_4_ = auVar328._12_4_ * auVar147._12_4_;
                auVar150 = vsubps_avx(auVar149,auVar234);
                auVar147 = vrcpss_avx(auVar183,auVar183);
                auVar183 = vmaxss_avx(ZEXT416((uint)local_860),
                                      ZEXT416((uint)(local_b00 * (float)local_6c0._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar101 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar79 = CONCAT44(auVar328._4_4_,auVar328._0_4_);
                local_a00._0_8_ = uVar79 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar328._8_4_;
                local_a00._12_4_ = -auVar328._12_4_;
                auVar113 = ZEXT416((uint)(fVar162 * 1.5 +
                                         fVar101 * -0.5 * fVar162 * fVar162 * fVar162));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar212._0_4_ = auVar113._0_4_ * auVar150._0_4_ * auVar147._0_4_;
                auVar212._4_4_ = auVar113._4_4_ * auVar150._4_4_ * auVar147._4_4_;
                auVar212._8_4_ = auVar113._8_4_ * auVar150._8_4_ * auVar147._8_4_;
                auVar212._12_4_ = auVar113._12_4_ * auVar150._12_4_ * auVar147._12_4_;
                auVar278._0_4_ = auVar328._0_4_ * auVar113._0_4_;
                auVar278._4_4_ = auVar328._4_4_ * auVar113._4_4_;
                auVar278._8_4_ = auVar328._8_4_ * auVar113._8_4_;
                auVar278._12_4_ = auVar328._12_4_ * auVar113._12_4_;
                local_9c0._0_4_ = auVar183._0_4_;
                if (fVar101 < 0.0) {
                  local_9e0._0_4_ = auVar112._0_4_;
                  local_a20._0_16_ = auVar278;
                  local_880._0_16_ = auVar212;
                  auVar383 = ZEXT1664(auVar214);
                  fVar162 = sqrtf(fVar101);
                  auVar367 = ZEXT464((uint)local_9e0._0_4_);
                  auVar212 = local_880._0_16_;
                  auVar278 = local_a20._0_16_;
                  fVar101 = (float)local_9c0._0_4_;
                }
                else {
                  auVar214 = vsqrtss_avx(auVar114,auVar114);
                  fVar162 = auVar214._0_4_;
                  fVar101 = auVar183._0_4_;
                }
                auVar214 = vdpps_avx(_local_a40,auVar278,0x7f);
                local_9e0._0_4_ =
                     (local_860 / fVar162) * (auVar367._0_4_ + 1.0) +
                     auVar367._0_4_ * local_860 + fVar101;
                auVar112 = vdpps_avx(local_a00._0_16_,auVar278,0x7f);
                auVar183 = vdpps_avx(_local_a40,auVar212,0x7f);
                auVar84._4_4_ = fStack_83c;
                auVar84._0_4_ = local_840;
                auVar84._8_4_ = fStack_838;
                auVar84._12_4_ = aStack_834.a;
                auVar114 = vdpps_avx(auVar84,auVar278,0x7f);
                auVar147 = vdpps_avx(_local_a40,local_a00._0_16_,0x7f);
                fVar162 = auVar112._0_4_ + auVar183._0_4_;
                fVar166 = auVar214._0_4_;
                auVar115._0_4_ = fVar166 * fVar166;
                auVar115._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                auVar115._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                auVar115._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                auVar183 = vsubps_avx(auVar208,auVar115);
                local_a00._0_16_ = ZEXT416((uint)fVar162);
                auVar112 = vdpps_avx(_local_a40,auVar84,0x7f);
                fVar201 = auVar147._0_4_ - fVar166 * fVar162;
                fVar166 = auVar112._0_4_ - fVar166 * auVar114._0_4_;
                auVar112 = vrsqrtss_avx(auVar183,auVar183);
                fVar222 = auVar183._0_4_;
                fVar162 = auVar112._0_4_;
                fVar162 = fVar162 * 1.5 + fVar222 * -0.5 * fVar162 * fVar162 * fVar162;
                if (fVar222 < 0.0) {
                  local_a20._0_16_ = auVar214;
                  local_880._0_16_ = auVar114;
                  local_6e0._0_4_ = fVar201;
                  local_700._0_4_ = fVar166;
                  local_720._0_4_ = fVar162;
                  auVar367 = ZEXT1664(auVar367._0_16_);
                  auVar383 = ZEXT1664(auVar383._0_16_);
                  fVar222 = sqrtf(fVar222);
                  fVar162 = (float)local_720._0_4_;
                  fVar201 = (float)local_6e0._0_4_;
                  fVar166 = (float)local_700._0_4_;
                  auVar114 = local_880._0_16_;
                  auVar214 = local_a20._0_16_;
                  fVar101 = (float)local_9c0._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar183,auVar183);
                  fVar222 = auVar112._0_4_;
                }
                auVar371 = ZEXT1664(auVar208);
                auVar147 = vpermilps_avx(local_820._0_16_,0xff);
                auVar113 = vshufps_avx(auVar328,auVar328,0xff);
                fVar223 = fVar201 * fVar162 - auVar113._0_4_;
                auVar235._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = auVar114._8_4_ ^ 0x80000000;
                auVar235._12_4_ = auVar114._12_4_ ^ 0x80000000;
                auVar255._0_4_ = -fVar223;
                auVar255._4_4_ = 0x80000000;
                auVar255._8_4_ = 0x80000000;
                auVar255._12_4_ = 0x80000000;
                fVar201 = local_a00._0_4_ * fVar166 * fVar162;
                auVar285 = ZEXT464((uint)fVar201);
                auVar112 = vinsertps_avx(auVar255,ZEXT416((uint)(fVar166 * fVar162)),0x1c);
                auVar114 = vmovsldup_avx(ZEXT416((uint)(fVar201 - auVar114._0_4_ * fVar223)));
                auVar112 = vdivps_avx(auVar112,auVar114);
                auVar183 = vinsertps_avx(local_a00._0_16_,auVar235,0x10);
                auVar183 = vdivps_avx(auVar183,auVar114);
                auVar114 = vmovsldup_avx(auVar214);
                auVar150 = ZEXT416((uint)(fVar222 - auVar147._0_4_));
                auVar147 = vmovsldup_avx(auVar150);
                auVar185._0_4_ = auVar114._0_4_ * auVar112._0_4_ + auVar147._0_4_ * auVar183._0_4_;
                auVar185._4_4_ = auVar114._4_4_ * auVar112._4_4_ + auVar147._4_4_ * auVar183._4_4_;
                auVar185._8_4_ = auVar114._8_4_ * auVar112._8_4_ + auVar147._8_4_ * auVar183._8_4_;
                auVar185._12_4_ =
                     auVar114._12_4_ * auVar112._12_4_ + auVar147._12_4_ * auVar183._12_4_;
                auVar112 = vsubps_avx(auVar342,auVar185);
                auVar345 = ZEXT1664(auVar112);
                auVar186._8_4_ = 0x7fffffff;
                auVar186._0_8_ = 0x7fffffff7fffffff;
                auVar186._12_4_ = 0x7fffffff;
                auVar214 = vandps_avx(auVar214,auVar186);
                if (auVar214._0_4_ < (float)local_9e0._0_4_) {
                  auVar213._8_4_ = 0x7fffffff;
                  auVar213._0_8_ = 0x7fffffff7fffffff;
                  auVar213._12_4_ = 0x7fffffff;
                  auVar214 = vandps_avx(auVar150,auVar213);
                  if (auVar214._0_4_ <
                      (float)local_740._0_4_ * 1.9073486e-06 + fVar101 + (float)local_9e0._0_4_) {
                    fVar101 = auVar112._0_4_ + (float)local_800._0_4_;
                    bVar89 = 0;
                    bVar88 = 0;
                    if (fVar101 < (ray->org).field_0.m128[3]) goto LAB_00f3480c;
                    fVar162 = ray->tfar;
                    auVar311 = ZEXT3264(local_a60);
                    auVar331 = ZEXT3264(_local_900);
                    if (fVar162 < fVar101) goto LAB_00f3481e;
                    auVar214 = vmovshdup_avx(auVar112);
                    bVar89 = 0;
                    fVar166 = auVar214._0_4_;
                    if ((fVar166 < 0.0) || (1.0 < fVar166)) goto LAB_00f3481e;
                    auVar214 = vrsqrtss_avx(auVar208,auVar208);
                    fVar222 = auVar214._0_4_;
                    pGVar13 = (context->scene->geometries).items[uVar90].ptr;
                    if ((pGVar13->mask & ray->mask) == 0) {
                      bVar89 = 0;
                      goto LAB_00f3481e;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar89 = 1, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_00f3481e;
                    auVar214 = ZEXT416((uint)(fVar222 * 1.5 +
                                             fVar140 * -0.5 * fVar222 * fVar222 * fVar222));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar215._0_4_ = auVar214._0_4_ * (float)local_a40._0_4_;
                    auVar215._4_4_ = auVar214._4_4_ * (float)local_a40._4_4_;
                    auVar215._8_4_ = auVar214._8_4_ * fStack_a38;
                    auVar215._12_4_ = auVar214._12_4_ * fStack_a34;
                    auVar116._0_4_ = auVar328._0_4_ + auVar113._0_4_ * auVar215._0_4_;
                    auVar116._4_4_ = auVar328._4_4_ + auVar113._4_4_ * auVar215._4_4_;
                    auVar116._8_4_ = auVar328._8_4_ + auVar113._8_4_ * auVar215._8_4_;
                    auVar116._12_4_ = auVar328._12_4_ + auVar113._12_4_ * auVar215._12_4_;
                    auVar214 = vshufps_avx(auVar215,auVar215,0xc9);
                    auVar183 = vshufps_avx(auVar328,auVar328,0xc9);
                    auVar216._0_4_ = auVar183._0_4_ * auVar215._0_4_;
                    auVar216._4_4_ = auVar183._4_4_ * auVar215._4_4_;
                    auVar216._8_4_ = auVar183._8_4_ * auVar215._8_4_;
                    auVar216._12_4_ = auVar183._12_4_ * auVar215._12_4_;
                    auVar236._0_4_ = auVar328._0_4_ * auVar214._0_4_;
                    auVar236._4_4_ = auVar328._4_4_ * auVar214._4_4_;
                    auVar236._8_4_ = auVar328._8_4_ * auVar214._8_4_;
                    auVar236._12_4_ = auVar328._12_4_ * auVar214._12_4_;
                    auVar114 = vsubps_avx(auVar236,auVar216);
                    auVar214 = vshufps_avx(auVar114,auVar114,0xc9);
                    auVar183 = vshufps_avx(auVar116,auVar116,0xc9);
                    auVar237._0_4_ = auVar183._0_4_ * auVar214._0_4_;
                    auVar237._4_4_ = auVar183._4_4_ * auVar214._4_4_;
                    auVar237._8_4_ = auVar183._8_4_ * auVar214._8_4_;
                    auVar237._12_4_ = auVar183._12_4_ * auVar214._12_4_;
                    auVar214 = vshufps_avx(auVar114,auVar114,0xd2);
                    auVar117._0_4_ = auVar116._0_4_ * auVar214._0_4_;
                    auVar117._4_4_ = auVar116._4_4_ * auVar214._4_4_;
                    auVar117._8_4_ = auVar116._8_4_ * auVar214._8_4_;
                    auVar117._12_4_ = auVar116._12_4_ * auVar214._12_4_;
                    auVar183 = vsubps_avx(auVar237,auVar117);
                    auVar214 = vshufps_avx(auVar183,auVar183,0xe9);
                    local_8c0 = vmovlps_avx(auVar214);
                    local_8b8 = auVar183._0_4_;
                    local_8b0 = 0;
                    local_8ac = (undefined4)local_888;
                    local_8a4 = context->user->instID[0];
                    local_8a0 = context->user->instPrimID[0];
                    ray->tfar = fVar101;
                    local_a64 = -1;
                    local_950.valid = &local_a64;
                    local_950.geometryUserPtr = pGVar13->userPtr;
                    local_950.context = context->user;
                    local_950.hit = (RTCHitN *)&local_8c0;
                    local_950.N = 1;
                    local_950.ray = (RTCRayN *)ray;
                    local_8b4 = fVar166;
                    local_8a8 = uVar90;
                    if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f34a4b:
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        auVar367 = ZEXT1664(auVar367._0_16_);
                        auVar371 = ZEXT1664(auVar371._0_16_);
                        auVar383 = ZEXT1664(auVar383._0_16_);
                        (*p_Var17)(&local_950);
                        if (*local_950.valid == 0) goto LAB_00f34a92;
                      }
                      bVar88 = 1;
                    }
                    else {
                      auVar285 = ZEXT464((uint)fVar201);
                      auVar345 = ZEXT1664(auVar112);
                      auVar367 = ZEXT1664(auVar367._0_16_);
                      auVar371 = ZEXT1664(auVar208);
                      auVar383 = ZEXT1664(auVar383._0_16_);
                      (*pGVar13->occlusionFilterN)(&local_950);
                      if (*local_950.valid != 0) goto LAB_00f34a4b;
LAB_00f34a92:
                      ray->tfar = fVar162;
                      bVar88 = 0;
                    }
                    goto LAB_00f3480c;
                  }
                }
                bVar100 = uVar93 < 4;
                uVar93 = uVar93 + 1;
              } while (uVar93 != 5);
              bVar100 = false;
              bVar88 = 5;
LAB_00f3480c:
              bVar89 = bVar88;
              auVar311 = ZEXT3264(local_a60);
              auVar331 = ZEXT3264(_local_900);
LAB_00f3481e:
              bVar97 = (bool)(bVar97 | bVar100 & bVar89);
              fVar101 = ray->tfar;
              auVar127._4_4_ = fVar101;
              auVar127._0_4_ = fVar101;
              auVar127._8_4_ = fVar101;
              auVar127._12_4_ = fVar101;
              auVar127._16_4_ = fVar101;
              auVar127._20_4_ = fVar101;
              auVar127._24_4_ = fVar101;
              auVar127._28_4_ = fVar101;
              auVar119 = vcmpps_avx(_local_920,auVar127,2);
              auVar118 = vandps_avx(auVar119,local_6a0);
              auVar119 = local_6a0 & auVar119;
              local_6a0 = auVar118;
            } while ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar119 >> 0x7f,0) != '\0') ||
                       (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar119 >> 0xbf,0) != '\0') ||
                     (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar119[0x1f] < '\0');
          }
          auVar118 = vandps_avx(local_580,local_660);
          auVar119 = vandps_avx(_local_7a0,_local_8e0);
          auVar238._0_4_ = auVar311._0_4_ + local_4c0._0_4_;
          auVar238._4_4_ = auVar311._4_4_ + local_4c0._4_4_;
          auVar238._8_4_ = auVar311._8_4_ + local_4c0._8_4_;
          auVar238._12_4_ = auVar311._12_4_ + local_4c0._12_4_;
          auVar238._16_4_ = auVar311._16_4_ + local_4c0._16_4_;
          auVar238._20_4_ = auVar311._20_4_ + local_4c0._20_4_;
          auVar238._24_4_ = auVar311._24_4_ + local_4c0._24_4_;
          auVar238._28_4_ = auVar311._28_4_ + local_4c0._28_4_;
          auVar31 = vcmpps_avx(auVar238,auVar127,2);
          auVar118 = vandps_avx(auVar31,auVar118);
          auVar239._0_4_ = local_500._0_4_ + auVar311._0_4_;
          auVar239._4_4_ = local_500._4_4_ + auVar311._4_4_;
          auVar239._8_4_ = local_500._8_4_ + auVar311._8_4_;
          auVar239._12_4_ = local_500._12_4_ + auVar311._12_4_;
          auVar239._16_4_ = local_500._16_4_ + auVar311._16_4_;
          auVar239._20_4_ = local_500._20_4_ + auVar311._20_4_;
          auVar239._24_4_ = local_500._24_4_ + auVar311._24_4_;
          auVar239._28_4_ = local_500._28_4_ + auVar311._28_4_;
          auVar31 = vcmpps_avx(auVar239,auVar127,2);
          auVar119 = vandps_avx(auVar31,auVar119);
          auVar119 = vorps_avx(auVar118,auVar119);
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar119;
            auVar118 = vblendvps_avx(_local_500,local_4c0,auVar118);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar118;
            uVar8 = vmovlps_avx(local_510);
            (&uStack_140)[uVar99 * 0xc] = uVar8;
            aiStack_138[uVar99 * 0x18] = local_b04 + 1;
            iVar98 = iVar98 + 1;
          }
          goto LAB_00f33445;
        }
      }
      auVar367 = ZEXT3264(_local_900);
      auVar311 = ZEXT3264(local_a60);
    }
LAB_00f33445:
    auVar11._0_4_ = ray->tfar;
    auVar11._4_4_ = ray->mask;
    auVar11._8_4_ = ray->id;
    auVar11._12_4_ = ray->flags;
    if (iVar98 == 0) break;
    fVar101 = ray->tfar;
    auVar153._4_4_ = fVar101;
    auVar153._0_4_ = fVar101;
    auVar153._8_4_ = fVar101;
    auVar153._12_4_ = fVar101;
    auVar153._16_4_ = fVar101;
    auVar153._20_4_ = fVar101;
    auVar153._24_4_ = fVar101;
    auVar153._28_4_ = fVar101;
    uVar94 = -iVar98;
    pauVar92 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar98 - 1) * 0x60);
    while( true ) {
      auVar118 = pauVar92[1];
      auVar191._0_4_ = auVar311._0_4_ + auVar118._0_4_;
      auVar191._4_4_ = auVar311._4_4_ + auVar118._4_4_;
      auVar191._8_4_ = auVar311._8_4_ + auVar118._8_4_;
      auVar191._12_4_ = auVar311._12_4_ + auVar118._12_4_;
      auVar191._16_4_ = auVar311._16_4_ + auVar118._16_4_;
      auVar191._20_4_ = auVar311._20_4_ + auVar118._20_4_;
      auVar191._24_4_ = auVar311._24_4_ + auVar118._24_4_;
      auVar191._28_4_ = auVar311._28_4_ + auVar118._28_4_;
      auVar31 = vcmpps_avx(auVar191,auVar153,2);
      auVar263 = ZEXT3264(auVar31);
      auVar119 = vandps_avx(auVar31,*pauVar92);
      local_4c0 = auVar119;
      auVar31 = *pauVar92 & auVar31;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0x7f,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0xbf,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar31[0x1f] < '\0') break;
      pauVar92 = pauVar92 + -3;
      uVar94 = uVar94 + 1;
      if (uVar94 == 0) goto LAB_00f34c42;
    }
    auVar125._8_4_ = 0x7f800000;
    auVar125._0_8_ = 0x7f8000007f800000;
    auVar125._12_4_ = 0x7f800000;
    auVar125._16_4_ = 0x7f800000;
    auVar125._20_4_ = 0x7f800000;
    auVar125._24_4_ = 0x7f800000;
    auVar125._28_4_ = 0x7f800000;
    auVar118 = vblendvps_avx(auVar125,auVar118,auVar119);
    auVar31 = vshufps_avx(auVar118,auVar118,0xb1);
    auVar31 = vminps_avx(auVar118,auVar31);
    auVar30 = vshufpd_avx(auVar31,auVar31,5);
    auVar31 = vminps_avx(auVar31,auVar30);
    auVar30 = vperm2f128_avx(auVar31,auVar31,1);
    auVar31 = vminps_avx(auVar31,auVar30);
    auVar118 = vcmpps_avx(auVar118,auVar31,0);
    auVar31 = auVar119 & auVar118;
    if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0x7f,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar31 >> 0xbf,0) != '\0') ||
        (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar31[0x1f] < '\0')
    {
      auVar119 = vandps_avx(auVar118,auVar119);
    }
    auVar106._8_8_ = 0;
    auVar106._0_8_ = *(ulong *)pauVar92[2];
    local_b04 = *(uint *)(pauVar92[2] + 8);
    uVar95 = vmovmskps_avx(auVar119);
    uVar91 = 0;
    if (uVar95 != 0) {
      for (; (uVar95 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
      }
    }
    *(undefined4 *)(local_4c0 + (ulong)uVar91 * 4) = 0;
    *pauVar92 = local_4c0;
    uVar95 = ~uVar94;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar95 = -uVar94;
    }
    uVar99 = (ulong)uVar95;
    auVar208 = vshufps_avx(auVar106,auVar106,0);
    auVar214 = vshufps_avx(auVar106,auVar106,0x55);
    auVar214 = vsubps_avx(auVar214,auVar208);
    local_500._4_4_ = auVar208._4_4_ + auVar214._4_4_ * 0.14285715;
    local_500._0_4_ = auVar208._0_4_ + auVar214._0_4_ * 0.0;
    fStack_4f8 = auVar208._8_4_ + auVar214._8_4_ * 0.2857143;
    fStack_4f4 = auVar208._12_4_ + auVar214._12_4_ * 0.42857146;
    fStack_4f0 = auVar208._0_4_ + auVar214._0_4_ * 0.5714286;
    fStack_4ec = auVar208._4_4_ + auVar214._4_4_ * 0.71428573;
    fStack_4e8 = auVar208._8_4_ + auVar214._8_4_ * 0.8571429;
    fStack_4e4 = auVar208._12_4_ + auVar214._12_4_;
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (ulong)uVar91 * 4);
  } while( true );
LAB_00f34c42:
  if (bVar97 != false) {
    return bVar97;
  }
  auVar208 = vshufps_avx(auVar11,auVar11,0);
  auVar208 = vcmpps_avx(local_520,auVar208,2);
  uVar90 = vmovmskps_avx(auVar208);
  uVar90 = (uint)local_7e8 - 1 & (uint)local_7e8 & uVar90;
  if (uVar90 == 0) {
    return false;
  }
  goto LAB_00f322c1;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }